

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O3

void lj_asm_trace(jit_State *J,GCtrace *T)

{
  MCode *pMVar1;
  char *pcVar2;
  byte *pbVar3;
  anon_struct_8_4_c535eab0_for_IRIns_0 aVar4;
  char cVar5;
  uint8_t uVar6;
  short sVar7;
  CTypeID id;
  ExitNo exitno;
  SnapShot *pSVar8;
  GCtrace *T_00;
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  MCode *pMVar21;
  byte bVar22;
  CTInfo CVar23;
  Reg RVar24;
  int iVar25;
  uint uVar26;
  TRef TVar27;
  MCode *p_6;
  GCtrace *pGVar28;
  IRIns *pIVar29;
  uint *puVar30;
  SnapShot *pSVar31;
  byte *pbVar32;
  SnapEntry *pSVar33;
  MCode MVar34;
  undefined4 uVar35;
  Reg RVar36;
  uint uVar37;
  MCode *p_4;
  long lVar38;
  ushort *puVar39;
  code *pcVar40;
  byte bVar41;
  ushort uVar42;
  int iVar43;
  x86Shift xs;
  IRRef IVar44;
  IRCallID id_00;
  MCode *p;
  int iVar45;
  ulong uVar46;
  IRIns *pIVar47;
  SnapEntry *pSVar48;
  IRIns IVar49;
  Reg dest;
  uint uVar50;
  SnapEntry SVar51;
  RegSet RVar52;
  SnapEntry *pSVar53;
  CCallInfo *pCVar55;
  SnapEntry sn;
  uint uVar56;
  byte bVar57;
  IRRef1 IVar58;
  BCReg BVar59;
  MSize MVar60;
  code *target;
  BCReg BVar61;
  uint16_t *puVar62;
  long lVar63;
  MCode MVar64;
  MCode MVar65;
  int32_t iVar66;
  ulong uVar67;
  Reg rb;
  x86Op xVar68;
  uint uVar69;
  bool bVar70;
  bool bVar71;
  ushort uVar72;
  CTSize sz;
  IRRef args [64];
  ushort auStack_10372 [32537];
  code *pcStack_540;
  undefined8 local_530;
  int local_524;
  undefined8 local_520;
  IRIns *local_518;
  SnapEntry *local_510;
  undefined1 local_508 [172];
  RegSet RStack_45c;
  uint uStack_458;
  uint uStack_454;
  uint32_t local_450;
  int local_44c;
  uint local_448;
  uint local_444;
  IRRef local_440;
  uint local_43c;
  uint local_438;
  uint local_434;
  uint local_430;
  uint local_42c;
  uint local_428;
  int local_410;
  IRRef local_40c;
  IRRef local_408;
  IRRef local_404;
  undefined8 local_400;
  GCtrace *local_3f8;
  GCtrace *local_3f0;
  MCode *local_3e8;
  SnapEntry *local_3e0;
  SnapEntry *local_3d8;
  SnapEntry *local_3d0;
  undefined1 local_3c8 [16];
  SnapEntry *local_3b8;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  ushort local_370 [252];
  IRIns *local_178;
  uint local_16c;
  IRIns local_168;
  uint32_t local_160;
  ulong local_158;
  jit_State *local_150;
  GCtrace *local_148;
  global_State *local_140;
  CCallInfo local_138 [16];
  ulong uVar54;
  
  uVar46 = (ulong)(T->nins - 1);
  cVar5 = *(char *)((long)T->ir + uVar46 * 8 + 5);
  if ((cVar5 == '\x14') || (cVar5 == '\f')) {
    while ((cVar5 = *(char *)((long)T->ir + uVar46 * 8 + -3), cVar5 == '\x14' || (cVar5 == '\f'))) {
      uVar46 = uVar46 - 1;
    }
    T->nins = (IRRef)uVar46;
  }
  uVar56 = (J->cur).nins;
  if (J->irtoplim <= uVar56) {
    pcStack_540 = (code *)0x148b9c;
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar56 + 1;
  (J->cur).ir[uVar56] = (IRIns)0xc0000000000;
  pcStack_540 = (code *)0x143b9c;
  local_508._152_8_ = J;
  local_438 = uVar56;
  local_3f8 = T;
  pGVar28 = lj_trace_alloc(J->L,T);
  J->curfinal = pGVar28;
  local_450 = J->flags;
  local_404 = J->loopref;
  local_3b8 = (SnapEntry *)0x0;
  local_44c = 0;
  if ((ulong)J->parent == 0) {
    local_3f0 = (GCtrace *)0x0;
  }
  else {
    local_3f0 = (GCtrace *)(ulong)J->trace[J->parent].gcptr32;
  }
  pcStack_540 = (code *)0x143c04;
  local_508._128_8_ = lj_mcode_reserve(J,&local_3e8);
  local_3d8 = (SnapEntry *)local_508._128_8_;
  local_3e0 = (SnapEntry *)local_508._128_8_;
  local_508._136_8_ = local_3e8 + 0x40;
  uVar72 = local_3f8->nsnap;
  if (0x1ff < uVar72) {
    pcStack_540 = (code *)0x148bfb;
    lj_trace_err((jit_State *)local_508._152_8_,LJ_TRERR_SNAPOV);
  }
  if (uVar72 != 0) {
    MVar34 = '\x01';
    uVar46 = 0;
    do {
      pMVar21 = local_3e8;
      if (((MCode **)(local_508._152_8_ + 0x680))[uVar46] == (MCode *)0x0) {
        if ((ulong)local_508._128_8_ <= local_3e8 + 0x8d) goto LAB_001489c9;
        *local_3e8 = 'j';
        local_3e8[1] = (MCode)((int)uVar46 << 5);
        MVar64 = 'z';
        lVar38 = 0;
        MVar65 = MVar34;
        do {
          lVar63 = lVar38;
          local_3e8[lVar63 + 2] = 0xeb;
          local_3e8[lVar63 + 3] = MVar64;
          local_3e8[lVar63 + 4] = 'j';
          local_3e8[lVar63 + 5] = MVar65;
          MVar65 = MVar65 + '\x01';
          MVar64 = MVar64 + 0xfc;
          lVar38 = lVar63 + 4;
        } while ((int)(lVar63 + 4) != 0x7c);
        local_3e8[lVar63 + 6] = 'j';
        local_3e8[lVar63 + 7] = (MCode)(uVar46 >> 3);
        pMVar1 = local_3e8 + lVar63 + 8;
        pMVar1[0] = 199;
        pMVar1[1] = 'D';
        pMVar1[2] = '$';
        pMVar1[3] = '\x10';
        *(int *)(local_3e8 + lVar63 + 0xc) = local_508._152_4_ + 0xaa0;
        local_3e8[lVar63 + 0x10] = 0xe9;
        *(int *)(local_3e8 + lVar63 + 0x11) = 0x142272 - (int)local_3e8;
        *(MCode **)(local_508._152_8_ + 0x9d8) = local_3e8 + lVar63 + 0x15;
        local_3e8 = local_3e8 + lVar63 + 0x15;
        local_508._136_8_ = pMVar21 + lVar63 + 0x55;
        ((MCode **)(local_508._152_8_ + 0x680))[uVar46] = pMVar21;
      }
      uVar46 = uVar46 + 1;
      MVar34 = MVar34 + ' ';
    } while (uVar46 != uVar72 + 0x1f >> 5);
  }
  local_508._164_2_ = local_508._164_2_ & 0xff00;
  local_140 = (global_State *)(J[-1].penalty + 0x1b);
  pGVar28 = J->curfinal;
  local_148 = T;
  local_150 = J;
LAB_00143d8f:
  local_508._144_8_ = pGVar28->ir;
  (J->cur).nins = local_438;
  local_440 = local_438;
  pSVar53 = local_3e0;
  if (local_3b8 != (SnapEntry *)0x0) {
    if (((ulong)local_3b8 & 0xf) != 0) {
      pSVar53 = (SnapEntry *)((long)local_3e0 + (long)(int)-((uint)local_3b8 & 0xf));
      pcStack_540 = (code *)0x143dde;
      memset(pSVar53,0x90,(ulong)((uint)local_3b8 & 0xf));
    }
    local_3e0 = pSVar53;
    pSVar53 = (SnapEntry *)((long)pSVar53 + (ulong)(local_44c == 0) * 3);
  }
  local_3c8._0_8_ = (long)pSVar53 + -5;
  local_508._128_8_ = local_3c8._0_8_;
  if (local_404 == 0) {
    local_3c8._0_8_ = (SnapEntry *)0x0;
    local_508._128_8_ = pSVar53 + -3;
  }
  local_3d0 = (SnapEntry *)0x0;
  local_3c8._8_8_ = 0;
  local_400._0_4_ = 0;
  local_400._4_4_ = 0;
  local_408 = local_404;
  local_40c = local_404;
  if ((local_450 >> 0x19 & 1) == 0) {
    local_40c = 0xffffffff;
  }
  uVar6 = local_3f8->sinktags;
  local_440 = local_3f8->nins;
  uVar46 = (ulong)local_440;
  stack0xfffffffffffffba0 = ZEXT416(0xffffffef);
  local_380 = (undefined1  [16])0x0;
  local_390 = (undefined1  [16])0x0;
  local_3a0 = (undefined1  [16])0x0;
  local_3b0 = (undefined1  [16])0x0;
  lVar38 = 0;
  do {
    *(undefined8 *)(local_508 + lVar38 * 4) = 0xffff0000ffff0000;
    *(undefined8 *)(local_508 + lVar38 * 4 + 8) = 0xffff0000ffff0000;
    lVar38 = lVar38 + 4;
  } while (lVar38 != 0x20);
  if ((ulong)local_3f8->nk < 0x8000) {
    lVar38 = (ulong)local_3f8->nk << 3;
    do {
      *(undefined2 *)(local_508._144_8_ + lVar38 + 6) = 0xff;
      lVar63 = lVar38;
      if (((0x604208U >> (*(uint *)(local_508._144_8_ + lVar38 + 4) & 0x1f) & 1) != 0) &&
         (*(char *)(local_508._144_8_ + lVar38 + 5) != '\x1b')) {
        lVar63 = lVar38 + 8;
        *(int *)(local_508._144_8_ + lVar38) = (int)lVar63 + (int)local_508._144_8_;
      }
      lVar38 = lVar63 + 8;
    } while (lVar63 < 0x3fff8);
  }
  *(undefined2 *)(local_508._144_8_ + 0x40006) = 0x82;
  local_430 = local_440;
  local_434 = local_440;
  local_42c = (uint)local_3f8->nsnap;
  local_410 = 0;
  local_43c = 0x8000;
  local_438 = local_440;
  pIVar47 = (IRIns *)(local_508._144_8_ + 0x40008);
  if (local_3f0 != (GCtrace *)0x0) {
    pcStack_540 = (code *)0x143f91;
    pIVar29 = lj_snap_regspmap((jit_State *)local_508._152_8_,local_3f0,
                               *(ExitNo *)(local_508._152_8_ + 0x9ac),pIVar47);
    if (2000 < (long)pIVar29 - (long)pIVar47) {
LAB_00148ba1:
      pcStack_540 = (code *)0x148bb3;
      lj_trace_err((jit_State *)local_508._152_8_,LJ_TRERR_NYICOAL);
    }
    local_43c = (uint)((ulong)((long)pIVar29 + (-8 - local_508._144_8_)) >> 3);
    if (pIVar47 < pIVar29) {
      puVar39 = local_370;
      do {
        uVar72 = (pIVar47->field_0).prev;
        *puVar39 = uVar72;
        puVar39 = puVar39 + 1;
        IVar58 = uVar72 | 0x80;
        if (0xff < uVar72) {
          IVar58 = 0xff;
        }
        (pIVar47->field_0).prev = IVar58;
        pIVar47 = pIVar47 + 1;
      } while (pIVar47 < pIVar29);
    }
  }
  local_448 = 2;
  pIVar29 = (IRIns *)(local_508._144_8_ + uVar46 * 8);
  if (pIVar47 < pIVar29) {
    bVar71 = false;
    do {
      if (uVar6 != '\0') {
        if ((pIVar47->field_1).r != 0xfe) {
          if ((pIVar47->field_1).r != 0xfd) goto LAB_0014404e;
          (pIVar47->field_1).r = 0xfe;
        }
        goto LAB_0014428d;
      }
LAB_0014404e:
      uVar46 = local_508._168_8_;
      switch((pIVar47->field_1).o) {
      case '\x11':
        bVar71 = true;
        goto switchD_00144066_caseD_41;
      default:
        uVar72 = (pIVar47->field_0).op2;
LAB_00144249:
        if ((((short)uVar72 < 0) || (-1 < (short)(pIVar47->field_0).op1)) ||
           (IVar58 = *(IRRef1 *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op1 * 8 + 6),
           0xfc < (byte)IVar58)) goto switchD_00144066_caseD_41;
        (pIVar47->field_0).prev = IVar58;
        break;
      case '$':
      case '%':
      case '&':
        if ((local_450 & 0x40) == 0) goto switchD_00144066_caseD_27;
        goto switchD_00144066_caseD_41;
      case '\'':
      case '(':
switchD_00144066_caseD_27:
        uVar72 = (pIVar47->field_0).op2;
        if (((short)uVar72 < 0) && (0xfc < *(byte *)(local_508._144_8_ + (ulong)uVar72 * 8 + 6))) {
          *(undefined1 *)(local_508._144_8_ + (ulong)uVar72 * 8 + 6) = 0x81;
          if (bVar71) {
            stack0xfffffffffffffba0 = local_508._168_5_ | 0x200000000;
          }
          else {
            bVar71 = false;
          }
        }
        goto switchD_00144066_caseD_41;
      case ',':
      case '-':
switchD_00144066_caseD_2c:
        if (((pIVar47->field_1).t.irt & 0x1f) == 0xe) goto switchD_00144066_caseD_41;
        (pIVar47->field_0).prev = 0x80;
        if (!bVar71) goto LAB_001441c4;
        stack0xfffffffffffffba0 = uVar46 | 0xfc700000000;
        break;
      case '.':
        if (((pIVar47->field_1).t.irt & 0x1f) != 0xe) goto switchD_00144066_caseD_2c;
LAB_0014417e:
        if (bVar71) {
          stack0xfffffffffffffba0 = uVar46 | 0xffff0fc700000000;
        }
        (pIVar47->field_0).prev = 0x90;
        break;
      case '4':
        if (2 < (pIVar47->field_0).op2) goto LAB_0014417e;
        if ((local_450 & 0x20) != 0) goto switchD_00144066_caseD_41;
        (pIVar47->field_0).prev = 0x90;
        if (!bVar71) goto LAB_001441c4;
        stack0xfffffffffffffba0 = uVar46 | 0xf000100000000;
        break;
      case ';':
      case 'M':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case 'T':
      case 'U':
      case '[':
        (pIVar47->field_0).prev = 0x80;
        if (bVar71) {
          RStack_45c = 0xffff0fc7;
        }
        else {
LAB_001441c4:
          bVar71 = false;
        }
        break;
      case 'A':
      case 'B':
      case 'C':
      case 'E':
      case 'G':
      case 'Z':
        goto switchD_00144066_caseD_41;
      case 'W':
      case '\\':
        if (bVar71) {
          RStack_45c = 0xffff0fc7;
        }
        else {
          bVar71 = false;
        }
        goto switchD_00144066_caseD_41;
      case 'Y':
        if ((1 < (byte)(((pIVar47->field_1).t.irt & 0x1f) - 0xd)) &&
           (uVar72 = (pIVar47->field_0).op2, 1 < (ushort)((uVar72 & 0x1f) - 0xd)))
        goto LAB_00144249;
switchD_00144066_caseD_41:
        (pIVar47->field_0).prev = 0xff;
        break;
      case ']':
      case '^':
      case '_':
      case '`':
        uVar72 = (pIVar47->field_0).op2;
        pcStack_540 = (code *)0x1440aa;
        RVar36 = asm_setup_call_slots((ASMState *)local_508,pIVar47,lj_ir_callinfo + uVar72);
        (pIVar47->field_0).prev = (IRRef1)RVar36;
        if (bVar71) {
          RStack_45c = RStack_45c |
                       (uint)((*(byte *)((long)&lj_ir_callinfo[uVar72].flags + 1) & 4) >> 2) *
                       0x10000 - 0xf039;
        }
        else {
          bVar71 = false;
        }
        break;
      case 'a':
        pcStack_540 = (code *)0x1441dc;
        local_138[0].flags = asm_callx_flags((ASMState *)local_508,pIVar47);
        pcStack_540 = (code *)0x1441f6;
        RVar36 = asm_setup_call_slots((ASMState *)local_508,pIVar47,local_138);
        (pIVar47->field_0).prev = (IRRef1)RVar36;
        if (bVar71) {
          stack0xfffffffffffffba0 = local_508._168_8_ | 0xffff0fc700000000;
        }
      }
LAB_0014428d:
      uVar56 = local_448;
      pIVar47 = pIVar47 + 1;
    } while (pIVar47 < pIVar29);
    if ((local_448 & 1) == 0) goto LAB_001442a5;
    local_448 = local_448 + 1;
  }
  else {
LAB_001442a5:
    uVar56 = 0;
  }
  local_444 = uVar56;
  if (local_404 == 0) {
    pIVar47 = (IRIns *)(ulong)(local_3f8->nsnap - 1);
    pSVar8 = local_3f8->snap;
    uVar46 = (ulong)pSVar8[(long)pIVar47].nent;
    if (uVar46 != 0) {
      do {
        if ((local_3f8->snapmap[(ulong)pSVar8[(long)pIVar47].mapofs + (uVar46 - 1)] >> 0x10 & 1) !=
            0) {
          uVar56 = local_3f8->snapmap[(ulong)pSVar8[(long)pIVar47].mapofs + (uVar46 - 1)] >> 0x18;
          local_524 = (int)CONCAT71((int7)(uVar46 >> 8),1);
          goto LAB_00144320;
        }
        uVar46 = uVar46 - 1;
      } while (uVar46 != 0);
    }
    local_524 = 0;
    uVar56 = 0;
LAB_00144320:
    pSVar8 = pSVar8 + (long)pIVar47;
    local_400._0_4_ = (uint)pSVar8->topslot;
    if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
    pcStack_540 = (code *)0x144359;
    ra_allocref((ASMState *)local_508,0x8000,4);
    if (local_3f8->link == 0) {
      puVar30 = (uint *)(ulong)local_3f8->snapmap[(uint)pSVar8->nent + pSVar8->mapofs];
      if (((char)*puVar30 == 'W') &&
         (uVar46 = (ulong)(*(GCRef **)(local_508._152_8_ + 0x170))[*puVar30 >> 0x10].gcptr32,
         0xfffffffb < *(byte *)(uVar46 + 0x38) - 0x4d)) {
        puVar30 = (uint *)(uVar46 + 0x38);
      }
      if ((local_508._152_4_ + 0xaa0 == 0) &&
         ((*(byte *)local_508._128_8_ == 0xf || ((*(byte *)local_508._128_8_ & 0xf0) != 0x70)))) {
        *(byte *)(local_508._128_8_ + -1) = 0xf6;
        bVar22 = 0x45;
        lVar38 = -3;
        bVar57 = 0x33;
        lVar63 = -2;
      }
      else {
        *(SnapEntry *)(local_508._128_8_ + -4) = local_508._152_4_ + 0xaa0;
        bVar22 = 0x41;
        lVar38 = -6;
        bVar57 = 0xbe;
        lVar63 = -5;
      }
      *(byte *)(local_508._128_8_ + lVar63) = bVar57;
      pbVar32 = (byte *)(local_508._128_8_ + lVar38);
      *(byte *)(local_508._128_8_ + lVar38) = bVar22;
      if (((int)puVar30 == 0) && ((*pbVar32 == 0xf || ((*pbVar32 & 0xf0) != 0x70)))) {
        pbVar32[-1] = 0xdb;
        bVar22 = 0x33;
        lVar38 = -2;
      }
      else {
        *(int *)(pbVar32 + -4) = (int)puVar30;
        bVar22 = 0xbb;
        lVar38 = -5;
      }
      pbVar3 = pbVar32 + lVar38;
      pbVar32[lVar38] = bVar22;
      iVar43 = pSVar8->nslots - uVar56;
      uVar69 = *puVar30;
      uVar50 = (uVar69 & 0xff) - 0x3f;
      uVar50 = uVar50 >> 1 | (uint)((uVar50 & 1) != 0) << 0x1f;
      if (uVar50 - 1 < 2) {
        uVar50 = uVar69 >> 0x10 & 0xff;
        iVar43 = iVar43 + (~uVar69 >> 8 | 0xffffff00);
LAB_001444c6:
        iVar43 = iVar43 - uVar50;
LAB_001444c8:
        if (iVar43 == 0) goto LAB_001444d3;
LAB_001444e4:
        *(int *)(pbVar3 + -4) = iVar43;
        bVar22 = 0xb8;
        lVar38 = -5;
      }
      else {
        if (uVar50 == 0) {
          uVar50 = uVar69 >> 8 & 0xff;
          goto LAB_001444c6;
        }
        if (uVar50 == 5) {
          uVar50 = (uVar69 >> 0x10) + (uVar69 >> 8 & 0xff);
          goto LAB_001444c6;
        }
        if (0x58 < (uVar69 & 0xff)) goto LAB_001444c8;
LAB_001444d3:
        if ((*pbVar3 != 0xf) && ((*pbVar3 & 0xf0) == 0x70)) {
          iVar43 = 0;
          goto LAB_001444e4;
        }
        pbVar3[-1] = 0xc0;
        bVar22 = 0x33;
        lVar38 = -2;
      }
      local_508._128_8_ = pbVar3 + lVar38;
      pbVar3[lVar38] = bVar22;
      if (uVar56 != 0) goto LAB_00144519;
    }
    else if (uVar56 != 0) {
      *(SnapEntry *)(local_508._128_8_ + -4) = local_508._152_4_ - 0xb8;
      *(byte *)(local_508._128_8_ + -5) = 0x25;
      ((byte *)(local_508._128_8_ + -7))[0] = 0x89;
      ((byte *)(local_508._128_8_ + -7))[1] = 0x14;
      local_508._128_8_ = local_508._128_8_ + -7;
LAB_00144519:
      if (uVar56 < 0x10) {
        *(byte *)(local_508._128_8_ + -1) = (byte)(uVar56 * 8);
        local_508._128_8_ = local_508._128_8_ + -1;
        uVar35 = 0x830000fe;
      }
      else {
        *(uint *)(local_508._128_8_ + -4) = uVar56 * 8;
        local_508._128_8_ = local_508._128_8_ + -4;
        uVar35 = 0x810000fe;
      }
      *(byte *)(local_508._128_8_ + -1) = 0xc2;
      *(undefined4 *)(local_508._128_8_ + -5) = uVar35;
      local_508._128_8_ = (SnapEntry *)(local_508._128_8_ + -2);
    }
    if ((ulong)*(IRRef1 *)(local_508._152_8_ + 0x180) != 0) {
      (((IRIns *)(local_508._144_8_ + (ulong)*(IRRef1 *)(local_508._152_8_ + 0x180) * 8))->field_1).
      op12 = *(IRRef2 *)(local_508._152_8_ + 0x60);
      *(undefined1 *)(local_508._144_8_ + (ulong)*(IRRef1 *)(local_508._152_8_ + 0x180) * 8 + 5) =
           0x18;
    }
    uVar46 = (ulong)pSVar8->nent;
    local_518 = pIVar47;
    if (uVar46 != 0) {
      pSVar53 = local_3f8->snapmap + pSVar8->mapofs;
      pSVar31 = (SnapShot *)&local_3f8->nsnapmap;
      if (pSVar8 + 1 !=
          (SnapShot *)((long)&local_3f8->snap->mapofs + (ulong)((uint)local_3f8->nsnap * 0xc))) {
        pSVar31 = pSVar8 + 1;
      }
      local_510 = local_3f8->snapmap + (pSVar31->mapofs - 1);
      uVar67 = 0;
      local_530 = uVar46;
      local_520 = pSVar53;
      do {
        uVar18 = local_508._144_8_;
        uVar56 = pSVar53[uVar67];
        if ((uVar56 >> 0x12 & 1) == 0) {
          SVar51 = (uVar56 >> 0x18) * 8 - 8;
          uVar50 = uVar56 & 0xffff;
          uVar54 = (ulong)uVar50;
          bVar22 = *(byte *)(local_508._144_8_ + uVar54 * 8 + 4) & 0x1f;
          if (bVar22 == 0xe) {
            cVar5 = *(char *)(local_508._144_8_ + uVar54 * 8 + 6);
            RVar36 = (Reg)cVar5;
            if (cVar5 < '\0') {
              pcStack_540 = (code *)0x144636;
              RVar36 = ra_allocref((ASMState *)local_508,uVar50,0xffff0000);
            }
            bVar22 = (byte)RVar36 & 0x1f;
            uStack_458 = uStack_458 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22);
            pcStack_540 = (code *)0x14465f;
            emit_rmro((ASMState *)local_508,XO_MOVSDto,RVar36,2,SVar51);
            uVar46 = local_530;
            pSVar53 = local_520;
          }
          else {
            if (uVar50 < 0x8000) {
              if (2 < bVar22) {
                *(IRRef2 *)(local_508._128_8_ + -4) =
                     (((IRIns *)(local_508._144_8_ + uVar54 * 8))->field_1).op12;
                if (SVar51 == 0) {
                  local_508._128_8_ = local_508._128_8_ + -4;
                  bVar22 = 2;
                }
                else if (uVar56 < 0x11000000) {
                  *(byte *)(local_508._128_8_ + -5) = (byte)SVar51;
                  local_508._128_8_ = local_508._128_8_ + -5;
                  bVar22 = 0x42;
                }
                else {
                  *(SnapEntry *)(local_508._128_8_ + -8) = SVar51;
                  local_508._128_8_ = local_508._128_8_ + -8;
                  bVar22 = 0x82;
                }
                *(byte *)(local_508._128_8_ + -1) = bVar22;
                *(byte *)(local_508._128_8_ + -2) = 199;
                local_508._128_8_ = (SnapEntry *)(local_508._128_8_ + -2);
              }
            }
            else {
              cVar5 = *(char *)(local_508._144_8_ + uVar54 * 8 + 6);
              RVar36 = (Reg)cVar5;
              if (cVar5 < '\0') {
                pcStack_540 = (code *)0x1446c9;
                RVar36 = ra_allocref((ASMState *)local_508,uVar50,0xffeb);
              }
              bVar22 = (byte)RVar36 & 0x1f;
              uStack_458 = uStack_458 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22);
              pcStack_540 = (code *)0x14470c;
              emit_rmro((ASMState *)local_508,XO_MOVto,
                        -(uint)((0x604208U >> (*(uint *)(uVar18 + uVar54 * 8 + 4) & 0x1f) & 1) != 0)
                        & 0x80200 | RVar36,2,SVar51);
              uVar46 = local_530;
              pSVar53 = local_520;
            }
            uVar50 = (uVar56 >> 0x18) * 8;
            if ((uVar56 & 0x30000) == 0) {
              bVar22 = *(byte *)(uVar18 + uVar54 * 8 + 4) & 0x1f;
              if (bVar22 != 3) {
                *(int *)(local_508._128_8_ + -4) = (int)(char)~bVar22;
                if (uVar50 < 0x84) {
                  *(byte *)(local_508._128_8_ + -5) = (byte)(uVar50 - 4);
                  local_508._128_8_ = local_508._128_8_ + -5;
                  bVar22 = 0x42;
                }
                else {
                  *(uint *)(local_508._128_8_ + -8) = uVar50 - 4;
                  local_508._128_8_ = local_508._128_8_ + -8;
                  bVar22 = 0x82;
                }
                goto LAB_001447ce;
              }
            }
            else if (0xffffff < uVar56) {
              *(SnapEntry *)(local_508._128_8_ + -4) = *local_510;
              if (uVar50 < 0x84) {
                *(byte *)(local_508._128_8_ + -5) = (byte)(uVar50 - 4);
                local_508._128_8_ = local_508._128_8_ + -5;
                bVar22 = 0x42;
              }
              else {
                *(uint *)(local_508._128_8_ + -8) = uVar50 - 4;
                local_508._128_8_ = local_508._128_8_ + -8;
                bVar22 = 0x82;
              }
              local_510 = local_510 + -1;
LAB_001447ce:
              *(byte *)(local_508._128_8_ + -1) = bVar22;
              *(byte *)(local_508._128_8_ + -2) = 199;
              local_508._128_8_ = (SnapEntry *)(local_508._128_8_ + -2);
            }
          }
          if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
        }
        uVar67 = uVar67 + 1;
      } while (uVar46 != uVar67);
    }
    if ((char)local_524 == '\x01' && local_3f0 == (GCtrace *)0x0) {
      pcStack_540 = (code *)0x144838;
      asm_stack_check((ASMState *)local_508,(BCReg)local_400,(IRIns *)0x0,local_508._168_4_ & 0xffef
                      ,(ExitNo)local_518);
    }
  }
switchD_001448dc_caseD_c:
  do {
    local_440 = local_440 - 1;
    if (local_440 <= local_43c) goto LAB_00147ec0;
    pIVar47 = (IRIns *)(local_508._144_8_ + (ulong)local_440 * 8);
    pcStack_540 = (code *)0x14486d;
    asm_snap_prev((ASMState *)local_508);
  } while (((((char)(pIVar47->field_1).r < '\0') && ((pIVar47->field_1).s == '\0')) &&
           ((((pIVar47->field_1).t.irt | 0x60) & lj_ir_mode[(pIVar47->field_1).o]) < 0x60)) &&
          ((local_450 & 0x40000) != 0));
  if ((char)(pIVar47->field_1).t.irt < '\0') {
    pcStack_540 = (code *)0x1448aa;
    asm_snap_prep((ASMState *)local_508);
  }
  uVar18 = local_508._144_8_;
  if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
  switch((pIVar47->field_1).o) {
  case '\0':
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
  case '\n':
    goto switchD_001448dc_caseD_0;
  case '\b':
  case '\t':
    if ((*(char *)((long)pIVar47 + -3) == ':') && (local_440 - 1 == (uint)(pIVar47->field_0).op1)) {
      pcStack_540 = (code *)0x144b79;
      local_440 = (uint)(pIVar47->field_0).op1;
      asm_href((ASMState *)local_508,pIVar47 + -1,(uint)(pIVar47->field_1).o);
    }
    else {
switchD_001448dc_caseD_0:
      pcStack_540 = (code *)0x1448eb;
      asm_comp((ASMState *)local_508,pIVar47);
    }
    goto switchD_001448dc_caseD_c;
  case '\v':
    uVar56 = (uint)*(char *)(local_508._144_8_ + 0x40006);
    if ((int)uVar56 < 0) {
      pcStack_540 = (code *)0x14584e;
      uVar56 = ra_allocref((ASMState *)local_508,0x8000,0xffef);
    }
    bVar22 = (byte)uVar56 & 0x1f;
    uStack_458 = uStack_458 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22);
    uVar50 = (((IRIns *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op2 * 8))->field_1).op12;
    iVar43 = *(byte *)((ulong)uVar50 - 3) + 1;
    BVar59 = (BCReg)local_400 - iVar43;
    BVar61 = 0;
    if (0 < (int)BVar59) {
      BVar61 = BVar59;
    }
    local_400._0_4_ = BVar61;
    *(byte *)(local_508._144_8_ + 0x40004) = *(byte *)(local_508._144_8_ + 0x40004) | 0x20;
    *(SnapEntry *)(local_508._128_8_ + -4) = local_508._152_4_ - 0xb8;
    *(byte *)(local_508._128_8_ + -5) = 0x25;
    *(byte *)(local_508._128_8_ + -6) = (byte)uVar56 * '\b' & 0x38 | 4;
    *(byte *)(local_508._128_8_ + -7) = 0x89;
    if ((uVar56 & 8) == 0) {
      local_508._128_8_ = local_508._128_8_ + -7;
    }
    else {
      *(byte *)(local_508._128_8_ + -8) = 0x44;
      local_508._128_8_ = local_508._128_8_ + -8;
    }
    pcStack_540 = (code *)0x1462b0;
    emit_gri((ASMState *)local_508,0x838100,uVar56,iVar43 * -8);
    iVar43 = (local_42c & 0x1f) * 4 + (int)((MCode **)(local_508._152_8_ + 0x680))[local_42c >> 5];
    bVar22 = 0x85;
    iVar45 = (int)local_508._128_8_;
    if (local_508._128_8_ == local_3c8._0_8_) {
      local_44c = 1;
      *(int *)(local_508._128_8_ + 1) = (iVar43 - iVar45) + -5;
      if (local_3b8 == (SnapEntry *)0x0) {
        bVar22 = 0x84;
        iVar43 = iVar45;
        goto LAB_001462e7;
      }
      bVar57 = 0x74;
      lVar38 = -2;
      lVar63 = -1;
      bVar22 = 0;
    }
    else {
LAB_001462e7:
      *(int *)(local_508._128_8_ + -4) = iVar43 - iVar45;
      bVar57 = 0xf;
      lVar38 = -6;
      lVar63 = -5;
    }
    *(byte *)(local_508._128_8_ + lVar63) = bVar22;
    *(byte *)(local_508._128_8_ + lVar38) = bVar57;
    if ((int)(char)(byte)uVar50 == uVar50) {
      lVar63 = lVar38 + -1;
      *(byte *)(local_508._128_8_ + lVar38 + -1) = (byte)uVar50;
      xVar68 = XO_ARITHi8;
    }
    else {
      *(uint *)(local_508._128_8_ + lVar38 + -4) = uVar50;
      lVar63 = lVar38 + -4;
      xVar68 = XO_ARITHi;
    }
    local_508._128_8_ = local_508._128_8_ + lVar63;
    RVar36 = 7;
    goto LAB_001468a2;
  case '\f':
  case '\x10':
  case 'X':
  case 'b':
    goto switchD_001448dc_caseD_c;
  default:
    ((TValue *)(local_508._152_8_ + 0xa08))->n = (double)(pIVar47->field_1).o;
    pcStack_540 = (code *)0x148be9;
    lj_trace_err_info((jit_State *)local_508._152_8_,LJ_TRERR_NYIIR);
  case '\x0f':
    iVar43 = local_400._4_4_;
    for (pIVar29 = (IRIns *)(local_508._144_8_ + (ulong)(local_43c + 1) * 8); pIVar29 < pIVar47;
        pIVar29 = pIVar29 + 1) {
      if (((byte)((pIVar29->field_1).o + 0xb1) < 4) &&
         ((-1 < (char)(pIVar29->field_1).r || ((pIVar29->field_1).s != '\0')))) {
        iVar43 = iVar43 + 1;
        local_400._4_4_ = iVar43;
      }
    }
    if (iVar43 != 0) {
      pcStack_540 = (code *)0x145929;
      asm_gc_check((ASMState *)local_508);
    }
    local_400._4_4_ = -0x80000000;
    goto switchD_001448dc_caseD_c;
  case '\x11':
    local_428 = local_42c;
    if (local_400._4_4_ != 0) {
      pcStack_540 = (code *)0x1456a5;
      asm_gc_check((ASMState *)local_508);
    }
    local_408 = 0;
    local_3c8 = (undefined1  [16])0x0;
    if (local_40c != 0xffffffff) {
      local_40c = 0;
    }
    uVar56 = 0;
    if (uStack_454 != 0) {
      local_530 = local_530 & 0xffffffff00000000;
      uVar50 = uStack_454;
      do {
        do {
          uVar69 = 0;
          if (uVar50 != 0) {
            for (; (uVar50 >> uVar69 & 1) == 0; uVar69 = uVar69 + 1) {
            }
          }
          bVar22 = *(byte *)(local_508._144_8_ +
                            (ulong)*(ushort *)(local_3b0 + (ulong)uVar69 * 2) * 8 + 6);
          if (uVar69 == bVar22) {
            uVar26 = 1 << ((byte)uVar69 & 0x1f);
          }
          else {
            uVar26 = 1 << ((byte)uVar69 & 0x1f);
            if (((uint)local_508._168_4_ >> (uVar69 & 0x1f) & 1) == 0) {
              if ((*(byte *)(local_508._144_8_ +
                            (ulong)*(ushort *)(local_508 + (ulong)uVar69 * 4) * 8 + 4) & 0x20) != 0)
              {
                uVar56 = uVar56 | uVar26;
                uVar69 = 0;
                if (-1 < (char)bVar22) {
                  uVar69 = 1 << (bVar22 & 0x1f);
                }
                local_530 = CONCAT44(local_530._4_4_,(uint)local_530 | uVar69);
                goto LAB_001457a9;
              }
              pcStack_540 = (code *)0x145750;
              ra_restore((ASMState *)local_508,(uint)*(ushort *)(local_508 + (ulong)uVar69 * 4));
              if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
            }
            if (-1 < (char)bVar22) {
              pcStack_540 = (code *)0x14577c;
              ra_rename((ASMState *)local_508,(uint)bVar22,uVar69);
              if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
            }
          }
LAB_001457a9:
          uVar50 = uVar50 & ~uVar26;
        } while (uVar50 != 0);
        if (uVar56 == 0) {
          uVar56 = uStack_454;
          break;
        }
        if ((local_508._168_4_ & uVar56) == 0) {
          RVar52 = (uint)local_530;
          pcStack_540 = (code *)0x1457df;
          asm_phi_break((ASMState *)local_508,uVar56,(uint)local_530,0xffef);
          pcStack_540 = (code *)0x1457f0;
          asm_phi_break((ASMState *)local_508,uVar56,RVar52,0xffff0000);
          if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
        }
        uVar56 = 0;
        local_530 = local_530 & 0xffffffff00000000;
        uVar50 = uStack_454;
      } while (uStack_454 != 0);
    }
    uVar56 = ~(uVar56 | local_508._168_4_) & RStack_45c & 0xffff0000;
    while (uVar56 != 0) {
      uVar50 = 0;
      if (uVar56 != 0) {
        for (; (uVar56 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
        }
      }
      pcStack_540 = (code *)0x1468ea;
      ra_restore((ASMState *)local_508,(uint)*(ushort *)(local_508 + (ulong)uVar50 * 4));
      uVar56 = uVar56 & ~(1 << (uVar50 & 0x1f));
      if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
    }
    uVar56 = ~(uStack_454 | local_508._168_4_) & RStack_45c;
    while (uVar56 != 0) {
      uVar50 = 0;
      if (uVar56 != 0) {
        for (; (uVar56 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
        }
      }
      pcStack_540 = (code *)0x146935;
      ra_restore((ASMState *)local_508,(uint)*(ushort *)(local_508 + (ulong)uVar50 * 4));
      uVar56 = uVar56 & ~(1 << (uVar50 & 0x1f));
      if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
    }
    pSVar53 = (SnapEntry *)local_508._128_8_;
    for (uVar56 = uStack_454; local_508._128_8_ = pSVar53, uVar56 != 0;
        uVar56 = uVar56 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22)) {
      uVar69 = uVar56 >> 0x18 | (uVar56 & 0xff0000) >> 8 | (uVar56 & 0xff00) << 8 | uVar56 << 0x18;
      uVar50 = 0x1f;
      if (uVar69 != 0) {
        for (; uVar69 >> uVar50 == 0; uVar50 = uVar50 - 1) {
        }
      }
      uVar50 = uVar50 ^ 0x18;
      uVar72 = *(ushort *)(local_3b0 + (ulong)uVar50 * 2);
      uVar46 = (ulong)uVar72;
      if (*(char *)(local_508._144_8_ + uVar46 * 8 + 7) != '\0') {
        pIVar47 = (IRIns *)(local_508._144_8_ + uVar46 * 8);
        (pIVar47->field_1).t.irt = (pIVar47->field_1).t.irt & 0xdf;
        bVar22 = *(byte *)(local_508._144_8_ + uVar46 * 8 + 6);
        if ((char)bVar22 < '\0') {
          pcStack_540 = (code *)0x1469ab;
          RVar36 = ra_allocref((ASMState *)local_508,(uint)uVar72,1 << ((byte)uVar50 & 0x1f));
          bVar22 = (byte)RVar36;
        }
        uStack_458 = uStack_458 & (-2 << (bVar22 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar22 & 0x1f));
        pcStack_540 = (code *)0x1469db;
        emit_storeofs((ASMState *)local_508,pIVar47,uVar50,4,(uint)(pIVar47->field_1).s << 2);
        if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
      }
      bVar22 = (byte)uVar50 & 0x1f;
      pSVar53 = (SnapEntry *)local_508._128_8_;
    }
    uVar46 = (ulong)(local_438 - 1);
    if (*(char *)(local_508._144_8_ + uVar46 * 8 + 5) == '\x13') {
      pIVar47 = (IRIns *)(local_508._144_8_ + uVar46 * 8);
      bVar22 = 0;
      bVar71 = false;
      do {
        if (((pIVar47->field_1).s != '\0') &&
           (*(char *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op1 * 8 + 7) != '\0')) {
          bVar70 = (byte)(((pIVar47->field_1).t.irt & 0x1f) - 0xd) < 2;
          bVar22 = bVar22 | bVar70 + 1U;
          bVar71 = (bool)(bVar71 | !bVar70);
        }
        pcVar2 = (char *)((long)pIVar47 + -3);
        pIVar47 = pIVar47 + -1;
      } while (*pcVar2 == '\x13');
      if (bVar71) {
        if ((unique0x10002010 & (undefined1  [16])0xffef) == (undefined1  [16])0x0) {
          uVar67 = 0;
          uVar56 = -(uint)((0x604208U >>
                            (*(uint *)(local_508._144_8_ + (ulong)(ushort)local_508._0_2_ * 8 + 4) &
                            0x1f) & 1) != 0) & 0x80200;
          *(byte *)((long)pSVar53 + -1) = 0x24;
          ((byte *)((long)pSVar53 + -3))[0] = 0x8b;
          ((byte *)((long)pSVar53 + -3))[1] = 4;
          if ((short)uVar56 == 0) {
            local_508._128_8_ = (long)pSVar53 + -3;
          }
          else {
            local_508._128_8_ = pSVar53 + -1;
            *(byte *)(pSVar53 + -1) = (byte)(uVar56 >> 0x10) | 0x40;
          }
          uVar46 = (ulong)(local_438 - 1);
          if (*(char *)(local_508._144_8_ + uVar46 * 8 + 5) == '\x13') goto LAB_00147525;
        }
        else {
          uVar56 = 0;
          if ((unique0x10002010 & (undefined1  [16])0xffef) != (undefined1  [16])0x0) {
            for (; ((local_508._168_4_ & 0xffef) >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
            }
          }
          uVar67 = (ulong)uVar56;
LAB_00147525:
          pIVar47 = (IRIns *)(local_508._144_8_ + uVar46 * 8);
          do {
            if ((pIVar47->field_1).s != '\0') {
              bVar57 = *(byte *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op1 * 8 + 7);
              if ((bVar57 != 0) && (1 < (byte)(((pIVar47->field_1).t.irt & 0x1f) - 0xd))) {
                pcStack_540 = (code *)0x147572;
                emit_storeofs((ASMState *)local_508,
                              (IRIns *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op1 * 8),
                              (Reg)uVar67,4,(uint)bVar57 << 2);
                pcStack_540 = (code *)0x14758d;
                emit_loadofs((ASMState *)local_508,pIVar47,(Reg)uVar67,4,
                             (uint)(pIVar47->field_1).s << 2);
                if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
              }
            }
            pcVar2 = (char *)((long)pIVar47 + -3);
            pIVar47 = pIVar47 + -1;
          } while (*pcVar2 == '\x13');
        }
        if (((uint)local_508._168_4_ >> ((uint)uVar67 & 0x1f) & 1) == 0) {
          pcStack_540 = (code *)0x1475e1;
          emit_storeofs((ASMState *)local_508,
                        (IRIns *)(local_508._144_8_ + (ulong)*(ushort *)(local_508 + uVar67 * 4) * 8
                                 ),(uint)uVar67,4,0);
        }
      }
      if ((bVar22 & 2) != 0) {
        uVar56 = 0;
        bVar71 = (stack0xfffffffffffffba0 & (undefined1  [16])0xffff0000) != (undefined1  [16])0x0;
        if (bVar71) {
          for (; ((local_508._168_4_ & 0xffff0000) >> uVar56 & 1) == 0; uVar56 = uVar56 + 1) {
          }
        }
        uVar46 = 0x10;
        if (bVar71) {
          uVar46 = (ulong)uVar56;
        }
        uVar56 = (uint)uVar46;
        if (((uint)local_508._168_4_ >> (uVar56 & 0x1f) & 1) == 0) {
          pcStack_540 = (code *)0x14763d;
          emit_loadofs((ASMState *)local_508,
                       (IRIns *)(local_508._144_8_ + (ulong)*(ushort *)(local_508 + uVar46 * 4) * 8)
                       ,uVar56,4,0);
        }
        if (*(char *)(local_508._144_8_ + (ulong)(local_438 - 1) * 8 + 5) == '\x13') {
          pIVar47 = (IRIns *)(local_508._144_8_ + (ulong)(local_438 - 1) * 8);
          do {
            if ((pIVar47->field_1).s != '\0') {
              bVar22 = *(byte *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op1 * 8 + 7);
              if ((bVar22 != 0) && ((byte)(((pIVar47->field_1).t.irt & 0x1f) - 0xd) < 2)) {
                pcStack_540 = (code *)0x1476a5;
                emit_storeofs((ASMState *)local_508,
                              (IRIns *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op1 * 8),
                              uVar56,4,(uint)bVar22 << 2);
                pcStack_540 = (code *)0x1476c0;
                emit_loadofs((ASMState *)local_508,pIVar47,uVar56,4,(uint)(pIVar47->field_1).s << 2)
                ;
                if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
              }
            }
            pcVar2 = (char *)((long)pIVar47 + -3);
            pIVar47 = pIVar47 + -1;
          } while (*pcVar2 == '\x13');
        }
        if ((local_508._168_4_ & 1 << ((byte)uVar46 & 0x1f)) == 0) {
          pcStack_540 = (code *)0x147711;
          emit_storeofs((ASMState *)local_508,
                        (IRIns *)(local_508._144_8_ + (ulong)*(ushort *)(local_508 + uVar46 * 4) * 8
                                 ),uVar56,4,0);
        }
      }
    }
    iVar43 = (int)local_508._128_8_;
    if (local_3b8 == (SnapEntry *)0x0) {
      *(byte *)((long)local_3e0 + -5) = 0xe9;
      if (local_44c == 0) {
        iVar45 = iVar43 - (int)local_3e0;
        lVar38 = 3;
        lVar63 = -4;
        pSVar48 = local_3e0;
LAB_001477b9:
        *(int *)((long)local_3e0 + lVar63) = iVar45;
        pSVar33 = (SnapEntry *)(local_508._128_8_ + lVar38);
      }
      else {
        pSVar48 = (SnapEntry *)((long)local_3e0 + -5);
        iVar45 = iVar43 - (int)pSVar48;
        *(int *)((long)local_3e0 + -9) = iVar45;
        if (local_44c == 2) {
          iVar45 = iVar45 + 6;
          lVar38 = 8;
          lVar63 = -0xf;
          goto LAB_001477b9;
        }
        pSVar33 = (SnapEntry *)(local_508._128_8_ + 4);
      }
      if (pSVar48 + -0x20 <= pSVar33) {
        local_3b8 = pSVar33;
        local_440 = local_43c;
        local_3f8->nins = local_438;
      }
    }
    else {
      local_3b8 = (SnapEntry *)0x0;
      if (local_44c == 0) {
        *(char *)((long)local_3e0 + -1) = (char)local_508._128_8_ - (char)local_3e0;
        *(byte *)((long)local_3e0 + -2) = 0xeb;
      }
      else {
        *(byte *)((long)local_3e0 + -5) = 0xe9;
        bVar22 = (char)local_508._128_8_ - ((char)local_3e0 + -5);
        *(byte *)((long)local_3e0 + -6) = bVar22;
        if (local_44c == 2) {
          *(byte *)(local_3e0 + -2) = bVar22 + 2;
        }
      }
    }
    local_3d0 = (SnapEntry *)local_508._128_8_;
    if ((SnapEntry *)local_508._128_8_ != pSVar53) {
      *(int *)(local_508._128_8_ + -4) = (int)pSVar53 - iVar43;
      *(byte *)(local_508._128_8_ + -5) = 0xe9;
      local_508._128_8_ = local_508._128_8_ + -5;
      goto LAB_0014781f;
    }
    goto switchD_001448dc_caseD_c;
  case '\x12':
    bVar22 = *(byte *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op1 * 8 + 6);
    if ((char)bVar22 < '\0') {
      RVar52 = 0xffef;
      if ((byte)(((pIVar47->field_1).t.irt & 0x1f) - 0xd) < 2) {
        RVar52 = 0xffff0000;
      }
      pcStack_540 = (code *)0x145620;
      RVar36 = ra_allocref((ASMState *)local_508,(uint)(pIVar47->field_0).op1,RVar52);
      bVar22 = (byte)RVar36;
    }
    uStack_458 = uStack_458 & (-2 << (bVar22 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar22 & 0x1f));
    goto switchD_001448dc_caseD_c;
  case '\x13':
    uVar56 = 0xffef;
    if ((byte)(((pIVar47->field_1).t.irt & 0x1f) - 0xd) < 2) {
      uVar56 = 0xffff0000;
    }
    if ((pIVar47->field_1).r != 0xfe) {
      uVar46 = (ulong)(pIVar47->field_0).op1;
      if (*(char *)(local_508._144_8_ + uVar46 * 8 + 7) == '\0') {
        pIVar29 = (IRIns *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op2 * 8);
        if ((pIVar29->field_1).s == '\0') {
          uVar56 = uVar56 & ~uStack_454;
          if ((local_508._168_4_ & uVar56 & (local_508._168_4_ & uVar56) - 1) != 0) {
            if ((char)(pIVar29->field_1).r < '\0') {
              pcStack_540 = (code *)0x1472b2;
              RVar36 = ra_allocref((ASMState *)local_508,(uint)(pIVar47->field_0).op2,uVar56);
            }
            else {
              pcStack_540 = (code *)0x146e28;
              RVar36 = ra_scratch((ASMState *)local_508,uVar56);
              pcStack_540 = (code *)0x146e3c;
              emit_movrr((ASMState *)local_508,pIVar29,RVar36,(uint)(pIVar29->field_1).r);
            }
            bVar22 = (byte)RVar36;
            (pIVar47->field_1).r = bVar22;
            uStack_454 = uStack_454 | 1 << (bVar22 & 0x1f);
            *(IRRef1 *)(local_3b0 + (ulong)RVar36 * 2) = (pIVar47->field_0).op1;
            pbVar32 = (byte *)(uVar18 + uVar46 * 8 + 4);
            *pbVar32 = *pbVar32 | 0x20;
            if (*(char *)(uVar18 + uVar46 * 8 + 6) < '\0') {
              *(byte *)(uVar18 + uVar46 * 8 + 6) = bVar22 | 0x80;
            }
            goto switchD_001448dc_caseD_c;
          }
          if ((*(char *)(local_508._144_8_ + uVar46 * 8 + 6) < '\0') &&
             ((char)(pIVar29->field_1).r < '\0')) {
            pcStack_540 = (code *)0x145573;
            ra_spill((ASMState *)local_508,pIVar47);
            (pIVar29->field_1).s = (pIVar47->field_1).s;
            goto switchD_001448dc_caseD_c;
          }
        }
      }
      pcStack_540 = (code *)0x148bc5;
      lj_trace_err((jit_State *)local_508._152_8_,LJ_TRERR_NYIPHI);
    }
    goto switchD_001448dc_caseD_c;
  case '\x15':
    iVar43 = (local_42c & 0x1f) * 4 + (int)((MCode **)(local_508._152_8_ + 0x680))[local_42c >> 5];
    bVar22 = 0x85;
    iVar45 = (int)local_508._128_8_;
    if (local_508._128_8_ == local_3c8._0_8_) {
      local_44c = 1;
      *(int *)(local_508._128_8_ + 1) = (iVar43 - iVar45) + -5;
      if (local_3b8 == (SnapEntry *)0x0) {
        bVar22 = 0x84;
        iVar43 = iVar45;
        goto LAB_001453da;
      }
      bVar57 = 0x74;
      lVar38 = -2;
      lVar63 = -1;
      bVar22 = 0;
    }
    else {
LAB_001453da:
      *(int *)(local_508._128_8_ + -4) = iVar43 - iVar45;
      bVar57 = 0xf;
      lVar38 = -6;
      lVar63 = -5;
    }
    *(byte *)(local_508._128_8_ + lVar63) = bVar22;
    pbVar32 = (byte *)(local_508._128_8_ + lVar38);
    *pbVar32 = bVar57;
    pbVar32[-1] = 0x80;
    *(int *)(pbVar32 + -5) = local_508._152_4_ + -0x13f;
    pbVar32[-6] = 0x25;
    pbVar32[-8] = 0xf6;
    pbVar32[-7] = 4;
    local_508._128_8_ = pbVar32 + -8;
    goto switchD_001448dc_caseD_c;
  case '\x1f':
    pcStack_540 = (code *)0x145c53;
    asm_neg_not((ASMState *)local_508,pIVar47,XOg_NOT);
    goto switchD_001448dc_caseD_c;
  case ' ':
    pcStack_540 = (code *)0x145593;
    RVar36 = ra_dest((ASMState *)local_508,pIVar47,0xffef);
    uVar56._0_2_ = *(IROpT *)((long)pIVar47 + 4);
    uVar56._2_2_ = *(IRRef1 *)((long)pIVar47 + 6);
    uVar56 = -(uint)((0x604208U >> (uVar56 & 0x1f) & 1) != 0) & 0x80200;
    *(Reg *)(local_508._128_8_ + -4) = (RVar36 & 7) << 0x18 | 0xc80f00fd;
    uVar50 = RVar36 >> 3 & 1;
    if ((uVar56 >> 1 & 0xffff) == 0 && uVar50 == 0) {
      local_508._128_8_ = local_508._128_8_ + -2;
    }
    else {
      *(byte *)(local_508._128_8_ + -3) = (byte)(uVar56 >> 0x10) | (byte)uVar50 | 0x40;
      local_508._128_8_ = local_508._128_8_ + -3;
    }
    pcStack_540 = (code *)0x146829;
    ra_left((ASMState *)local_508,RVar36,(uint)(pIVar47->field_0).op1);
    goto switchD_001448dc_caseD_c;
  case '!':
    pcStack_540 = (code *)0x145b85;
    asm_intarith((ASMState *)local_508,pIVar47,XOg_AND);
    goto switchD_001448dc_caseD_c;
  case '\"':
    pcStack_540 = (code *)0x1459fd;
    asm_intarith((ASMState *)local_508,pIVar47,XOg_OR);
    goto switchD_001448dc_caseD_c;
  case '#':
    pcStack_540 = (code *)0x145bec;
    asm_intarith((ASMState *)local_508,pIVar47,XOg_XOR);
    goto switchD_001448dc_caseD_c;
  case '$':
    pcStack_540 = (code *)0x1453a3;
    asm_bitshift((ASMState *)local_508,pIVar47,XOg_SHL,XV_SHLX);
    goto switchD_001448dc_caseD_c;
  case '%':
    pcStack_540 = (code *)0x14564c;
    asm_bitshift((ASMState *)local_508,pIVar47,XOg_SHR,XV_SHRX);
    goto switchD_001448dc_caseD_c;
  case '&':
    pcStack_540 = (code *)0x145224;
    asm_bitshift((ASMState *)local_508,pIVar47,XOg_SAR,XV_SARX);
    goto switchD_001448dc_caseD_c;
  case '\'':
    xs = XOg_ROL;
    goto LAB_00145b97;
  case '(':
    xs = XOg_ROR;
LAB_00145b97:
    pcStack_540 = (code *)0x145b9e;
    asm_bitshift((ASMState *)local_508,pIVar47,xs,XOg_FADDq);
    goto switchD_001448dc_caseD_c;
  case ')':
    uVar56 = (pIVar47->field_1).t.irt & 0x1f;
    if (uVar56 != 0xe) {
      if ((local_3c8._8_8_ != local_508._128_8_) && ((0x604208U >> uVar56 & 1) == 0)) {
        uVar67 = (ulong)(pIVar47->field_0).op1;
        uVar46 = (ulong)(pIVar47->field_0).op2;
        local_508._164_2_ = 0x8080;
        local_508[0xa6] = '\0';
        local_508._160_4_ = 0;
        cVar5 = *(char *)(local_508._144_8_ + uVar67 * 8 + 6);
        if (cVar5 < '\0') {
          if ((((pIVar47->field_0).op1 != (pIVar47->field_0).op2) &&
              (*(char *)(local_508._144_8_ + uVar67 * 8 + 5) == ')')) &&
             ((local_40c < (pIVar47->field_0).op1 &&
              ((-1 < (short)(pIVar47->field_0).op2 ||
               (-1 < *(short *)(local_508._144_8_ + uVar67 * 8 + 2))))))) {
            cVar5 = *(char *)(local_508._144_8_ +
                             (ulong)(((IRIns *)(local_508._144_8_ + uVar67 * 8))->field_0).op1 * 8 +
                             6);
            uVar56 = (uint)cVar5;
            if (cVar5 < '\0') {
              pcStack_540 = (code *)0x147a41;
              uVar56 = ra_allocref((ASMState *)local_508,
                                   (uint)(((IRIns *)(local_508._144_8_ + uVar67 * 8))->field_0).op1,
                                   0xffef);
            }
            uVar50 = uStack_458 & ~(1 << (uVar56 & 0x1f));
            uStack_458 = uVar50;
            uVar69 = ~(1 << (uVar56 & 0x1f)) & 0xffef;
            local_508[0xa4] = (uint8_t)uVar56;
            if ((short)(pIVar47->field_0).op2 < 0) {
              local_508._160_4_ =
                   (((IRIns *)(local_508._144_8_ + (ulong)*(ushort *)(uVar18 + uVar67 * 8 + 2) * 8))
                   ->field_1).op12;
              uVar72 = (pIVar47->field_0).op2;
            }
            else {
              local_508._160_4_ = (((IRIns *)(uVar18 + uVar46 * 8))->field_1).op12;
              uVar72 = *(ushort *)(uVar18 + uVar67 * 8 + 2);
            }
            cVar5 = *(char *)(local_508._144_8_ + (ulong)uVar72 * 8 + 6);
            uVar56 = (uint)cVar5;
            if (cVar5 < '\0') {
              pcStack_540 = (code *)0x147d38;
              uVar56 = ra_allocref((ASMState *)local_508,(uint)uVar72,uVar69);
              uVar50 = uStack_458;
            }
            uStack_458 = uVar50 & ~(1 << (uVar56 & 0x1f));
            RVar52 = uVar69 & ~(1 << (uVar56 & 0x1f));
            local_508[0xa5] = (char)uVar56;
            goto LAB_00147d53;
          }
        }
        else {
          RVar52 = ~(1 << ((int)cVar5 & 0x1fU)) & 0xffef;
          uStack_458 = uStack_458 & ~(1 << ((int)cVar5 & 0x1fU));
          local_508[0xa4] = *(undefined1 *)(local_508._144_8_ + uVar67 * 8 + 6);
          local_508[0xa5] = 0x80;
          uVar72 = (pIVar47->field_0).op2;
          if (((short)uVar72 < 0) && (*(char *)(local_508._144_8_ + uVar46 * 8 + 6) < '\0')) {
            if (((*(char *)(local_508._144_8_ + uVar46 * 8 + 5) == ')') && (local_40c < uVar72)) &&
               (-1 < *(short *)(local_508._144_8_ + uVar46 * 8 + 2))) {
              cVar5 = *(char *)(local_508._144_8_ +
                               (ulong)(((IRIns *)(local_508._144_8_ + uVar46 * 8))->field_0).op1 * 8
                               + 6);
              uVar50 = (uint)cVar5;
              uVar56 = uStack_458;
              if (cVar5 < '\0') {
                pcStack_540 = (code *)0x147cd1;
                uVar50 = ra_allocref((ASMState *)local_508,
                                     (uint)(((IRIns *)(local_508._144_8_ + uVar46 * 8))->field_0).
                                           op1,RVar52);
                uVar56 = uStack_458;
              }
              uStack_458 = uVar56 & ~(1 << (uVar50 & 0x1f));
              RVar52 = RVar52 & ~(1 << (uVar50 & 0x1f));
              local_508[0xa5] = (char)uVar50;
              local_508._160_4_ =
                   (((IRIns *)(local_508._144_8_ + (ulong)*(ushort *)(uVar18 + uVar46 * 8 + 2) * 8))
                   ->field_1).op12;
LAB_00147d53:
              pcStack_540 = (code *)0x147d65;
              RVar36 = ra_dest((ASMState *)local_508,pIVar47,RVar52);
              xVar68 = XO_LEA;
              break;
            }
          }
          else {
            bVar22 = (pIVar47->field_1).r;
            if (((long)(char)bVar22 < 0) ||
               ((((*(byte *)(local_508._144_8_ + uVar67 * 8 + 4) & 0x40) == 0 ||
                 (*(IRRef1 *)(local_3b0 + (long)(char)bVar22 * 2) != (pIVar47->field_0).op1)) &&
                (((*(byte *)(local_508._144_8_ + uVar46 * 8 + 4) & 0x40) == 0 ||
                 (*(ushort *)(local_3b0 + (ulong)bVar22 * 2) != uVar72)))))) {
              if ((short)uVar72 < 0) {
                uVar56 = (uint)*(byte *)(local_508._144_8_ + uVar46 * 8 + 6);
                RVar52 = RVar52 & ~(1 << (uVar56 & 0x1f));
                uStack_458 = uStack_458 & ~(1 << (uVar56 & 0x1f));
                local_508[0xa5] = *(undefined1 *)(local_508._144_8_ + uVar46 * 8 + 6);
              }
              else {
                local_508._160_4_ = (((IRIns *)(local_508._144_8_ + uVar46 * 8))->field_1).op12;
              }
              goto LAB_00147d53;
            }
          }
        }
      }
      goto switchD_001448dc_caseD_35;
    }
    pcStack_540 = (code *)0x145c13;
    asm_fparith((ASMState *)local_508,pIVar47,XO_ADDSD);
    goto switchD_001448dc_caseD_c;
  case '*':
    if (((pIVar47->field_1).t.irt & 0x1f) != 0xe) goto switchD_001448dc_caseD_36;
    pcStack_540 = (code *)0x145bbe;
    asm_fparith((ASMState *)local_508,pIVar47,XO_SUBSD);
    goto switchD_001448dc_caseD_c;
  case '+':
    if (((pIVar47->field_1).t.irt & 0x1f) != 0xe) goto switchD_001448dc_caseD_37;
    pcStack_540 = (code *)0x145c73;
    asm_fparith((ASMState *)local_508,pIVar47,XO_MULSD);
    goto switchD_001448dc_caseD_c;
  case ',':
    bVar22 = (pIVar47->field_1).t.irt & 0x1f;
    if (bVar22 != 0xe) {
      id_00 = bVar22 == 0x15 ^ IRCALL_lj_carith_divu64;
      goto LAB_00146371;
    }
    pcStack_540 = (code *)0x1459e6;
    asm_fparith((ASMState *)local_508,pIVar47,XO_DIVSD);
    goto switchD_001448dc_caseD_c;
  case '-':
    bVar22 = (pIVar47->field_1).t.irt & 0x1f;
    if (bVar22 == 0x13) {
      aVar4 = pIVar47->field_0;
      auVar11._8_4_ = 0;
      auVar11._0_2_ = aVar4.op1;
      auVar11._2_2_ = aVar4.op2;
      auVar11._4_2_ = aVar4.ot;
      auVar11._6_2_ = aVar4.prev;
      auVar11._12_2_ = aVar4.prev;
      auVar14._8_2_ = aVar4.ot;
      auVar14._0_2_ = aVar4.op1;
      auVar14._2_2_ = aVar4.op2;
      auVar14._4_2_ = aVar4.ot;
      auVar14._6_2_ = aVar4.prev;
      auVar14._10_4_ = auVar11._10_4_;
      auVar17._6_8_ = 0;
      auVar17._0_6_ = auVar14._8_6_;
      uVar72 = aVar4.op1;
      local_138[0].func._4_4_ = (uint)CONCAT82(SUB148(auVar17 << 0x40,6),aVar4.op2);
      pCVar55 = lj_ir_callinfo + 0x23;
LAB_00145966:
      local_138[0].func._0_4_ = (uint)uVar72;
      pcStack_540 = (code *)0x145979;
      asm_setupresult((ASMState *)local_508,pIVar47,pCVar55);
      goto LAB_0014597f;
    }
    id_00 = bVar22 == 0x15 ^ IRCALL_lj_carith_modu64;
    goto LAB_00146371;
  case '.':
    bVar22 = (pIVar47->field_1).t.irt & 0x1f;
    if (bVar22 == 0xe) {
      aVar4 = pIVar47->field_0;
      auVar10._8_4_ = 0;
      auVar10._0_2_ = aVar4.op1;
      auVar10._2_2_ = aVar4.op2;
      auVar10._4_2_ = aVar4.ot;
      auVar10._6_2_ = aVar4.prev;
      auVar10._12_2_ = aVar4.prev;
      auVar13._8_2_ = aVar4.ot;
      auVar13._0_2_ = aVar4.op1;
      auVar13._2_2_ = aVar4.op2;
      auVar13._4_2_ = aVar4.ot;
      auVar13._6_2_ = aVar4.prev;
      auVar13._10_4_ = auVar10._10_4_;
      auVar16._6_8_ = 0;
      auVar16._0_6_ = auVar13._8_6_;
      uVar72 = aVar4.op1;
      local_138[0].func._4_4_ = (uint)CONCAT82(SUB148(auVar16 << 0x40,6),aVar4.op2);
      pCVar55 = lj_ir_callinfo + 0x38;
      goto LAB_00145966;
    }
    id_00 = bVar22 == 0x15 ^ IRCALL_lj_carith_powu64;
LAB_00146371:
    pcStack_540 = (code *)0x14637e;
    asm_callid((ASMState *)local_508,pIVar47,id_00);
    goto switchD_001448dc_caseD_c;
  case '/':
    if (((pIVar47->field_1).t.irt & 0x1f) == 0xe) {
      pcStack_540 = (code *)0x1459ab;
      asm_fparith((ASMState *)local_508,pIVar47,XO_XORPS);
    }
    else {
      pcStack_540 = (code *)0x146362;
      asm_neg_not((ASMState *)local_508,pIVar47,XOg_NEG);
    }
    goto switchD_001448dc_caseD_c;
  case '0':
    pcStack_540 = (code *)0x1459c2;
    asm_fparith((ASMState *)local_508,pIVar47,XO_ANDPS);
    goto switchD_001448dc_caseD_c;
  case '1':
    bVar22 = (pIVar47->field_1).s;
    SVar51 = (uint)bVar22 * 4;
    bVar57 = (pIVar47->field_1).r;
    if (-1 < (char)bVar57) {
      iVar43 = 1 << (bVar57 & 0x1f);
      stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
      pcStack_540 = (code *)0x145280;
      emit_rmro((ASMState *)local_508,XO_MOVSD,(int)(char)bVar57,4,SVar51);
    }
    if (bVar22 == 0) {
      bVar22 = 0x1c;
    }
    else if (bVar22 < 0x20) {
      *(byte *)(local_508._128_8_ + -1) = (byte)SVar51;
      local_508._128_8_ = local_508._128_8_ + -1;
      bVar22 = 0x5c;
    }
    else {
      *(SnapEntry *)(local_508._128_8_ + -4) = SVar51;
      local_508._128_8_ = local_508._128_8_ + -4;
      bVar22 = 0x9c;
    }
    *(byte *)(local_508._128_8_ + -1) = 0x24;
    *(byte *)(local_508._128_8_ + -2) = bVar22;
    *(byte *)(local_508._128_8_ + -3) = 0xdd;
    pbVar32 = (byte *)(local_508._128_8_ + -7);
    pbVar32[0] = 0xd9;
    pbVar32[1] = 0xfd;
    pbVar32[2] = 0xdd;
    pbVar32[3] = 0xd9;
    local_508._128_8_ = local_508._128_8_ + -7;
    pcStack_540 = (code *)0x146bd1;
    asm_x87load((ASMState *)local_508,(uint)(pIVar47->field_0).op1);
    pcStack_540 = (code *)0x146bdd;
    asm_x87load((ASMState *)local_508,(uint)(pIVar47->field_0).op2);
    goto switchD_001448dc_caseD_c;
  case '2':
    if (((pIVar47->field_1).t.irt & 0x1f) == 0xe) {
      pcStack_540 = (code *)0x145085;
      asm_fparith((ASMState *)local_508,pIVar47,XO_MINSD);
    }
    else {
      pcStack_540 = (code *)0x14614d;
      asm_intmin_max((ASMState *)local_508,pIVar47,0xf);
    }
    goto switchD_001448dc_caseD_c;
  case '3':
    if (((pIVar47->field_1).t.irt & 0x1f) == 0xe) {
      pcStack_540 = (code *)0x145e52;
      asm_fparith((ASMState *)local_508,pIVar47,XO_MAXSD);
    }
    else {
      pcStack_540 = (code *)0x1465ab;
      asm_intmin_max((ASMState *)local_508,pIVar47,0xc);
    }
    goto switchD_001448dc_caseD_c;
  case '4':
    uVar72 = (pIVar47->field_0).op2;
    if (uVar72 == 3) {
      pcStack_540 = (code *)0x144f36;
      RVar36 = ra_dest((ASMState *)local_508,pIVar47,0xffff0000);
      pcStack_540 = (code *)0x144f4a;
      RVar24 = asm_fuseload((ASMState *)local_508,(uint)(pIVar47->field_0).op1,0xffff0000);
      xVar68 = XO_SQRTSD;
      goto LAB_00147c1d;
    }
    if (uVar72 < 3) {
      if ((local_450 & 0x20) == 0) {
        bVar22 = (pIVar47->field_1).r & 0x1f;
        RVar52 = (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22) & 0xf0001;
        if ((char)(pIVar47->field_1).r < '\0') {
          RVar52 = 0xf0001;
        }
        pcStack_540 = (code *)0x1460f3;
        ra_evictset((ASMState *)local_508,RVar52);
        pcStack_540 = (code *)0x146103;
        ra_destreg((ASMState *)local_508,pIVar47,0x10);
        pcVar40 = lj_vm_trunc;
        if (uVar72 == 1) {
          pcVar40 = lj_vm_ceil;
        }
        target = lj_vm_floor;
        if (uVar72 != 0) {
          target = pcVar40;
        }
        pcStack_540 = (code *)0x14612d;
        emit_call_((ASMState *)local_508,(MCode *)target);
        pcStack_540 = (code *)0x14613e;
        ra_left((ASMState *)local_508,0x10,(uint)(pIVar47->field_0).op1);
      }
      else {
        pcStack_540 = (code *)0x1470c6;
        RVar36 = ra_dest((ASMState *)local_508,pIVar47,0xffff0000);
        pcStack_540 = (code *)0x1470da;
        RVar24 = asm_fuseload((ASMState *)local_508,(uint)(pIVar47->field_0).op1,0xffff0000);
        *(byte *)(local_508._128_8_ + -1) = (char)uVar72 + 9;
        pcStack_540 = (code *)0x147104;
        local_508._128_8_ = (byte *)(local_508._128_8_ + -1);
        emit_mrm((ASMState *)local_508,XO_ROUNDSD,RVar36,RVar24);
        uVar18 = local_508._128_8_;
        if (*(byte *)(local_508._128_8_ + 1) != 0x3a) {
          *(byte *)local_508._128_8_ = *(byte *)(local_508._128_8_ + 1);
          *(byte *)(local_508._128_8_ + 1) = 0xf;
        }
        local_508._128_8_ = (SnapEntry *)(local_508._128_8_ + -1);
        *(byte *)(uVar18 + -1) = 0x66;
      }
    }
    else {
      pcStack_540 = (code *)0x146c27;
      asm_callid((ASMState *)local_508,pIVar47,uVar72 + IRCALL_lj_vm_floor);
    }
    goto switchD_001448dc_caseD_c;
  case '5':
switchD_001448dc_caseD_35:
    pcStack_540 = (code *)0x1474ad;
    asm_intarith((ASMState *)local_508,pIVar47,XOg_ADD);
    goto switchD_001448dc_caseD_c;
  case '6':
switchD_001448dc_caseD_36:
    pcStack_540 = (code *)0x145bd5;
    asm_intarith((ASMState *)local_508,pIVar47,XOg_SUB);
    goto switchD_001448dc_caseD_c;
  case '7':
switchD_001448dc_caseD_37:
    pcStack_540 = (code *)0x145c8a;
    asm_intarith((ASMState *)local_508,pIVar47,XOg_X_IMUL);
    goto switchD_001448dc_caseD_c;
  case '8':
    pcStack_540 = (code *)0x145196;
    RVar36 = ra_dest((ASMState *)local_508,pIVar47,0xffef);
    pcStack_540 = (code *)0x1451a8;
    asm_fusearef((ASMState *)local_508,pIVar47,0xffef);
    xVar68 = XO_LEA;
    break;
  case '9':
    local_530 = (ulong)(((IRIns *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op2 * 8))->field_0)
                       .op1;
    uVar72 = *(ushort *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op2 * 8 + 2);
    if (((char)(pIVar47->field_1).r < '\0') && ((pIVar47->field_1).s == '\0')) {
      RVar36 = 0x80;
    }
    else {
      pcStack_540 = (code *)0x145af1;
      RVar36 = ra_dest((ASMState *)local_508,pIVar47,0xffef);
    }
    cVar5 = *(char *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op1 * 8 + 6);
    RVar24 = (Reg)cVar5;
    if (cVar5 < '\0') {
      pcStack_540 = (code *)0x145b17;
      RVar24 = ra_allocref((ASMState *)local_508,(uint)(pIVar47->field_0).op1,0xffef);
    }
    iVar43 = (uint)uVar72 * 0x18;
    bVar22 = (byte)RVar24;
    uStack_458 = uStack_458 & (-2 << (bVar22 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar22 & 0x1f));
    if (RVar36 < 0x80) {
      if (uVar72 == 0) {
        if (RVar36 != RVar24) {
          *(byte *)(local_508._128_8_ + -1) = (bVar22 & 7) + (char)RVar36 * '\b' | 0xc0;
          *(byte *)(local_508._128_8_ + -2) = 0x8b;
          uVar56 = RVar24 >> 3 & 1 | RVar36 >> 1 & 4;
          if (uVar56 == 0) {
            local_508._128_8_ = local_508._128_8_ + -2;
          }
          else {
            *(byte *)(local_508._128_8_ + -3) = (byte)uVar56 | 0x40;
            local_508._128_8_ = local_508._128_8_ + -3;
          }
        }
      }
      else if (RVar36 == RVar24) {
        pcStack_540 = (code *)0x145b6e;
        emit_gri((ASMState *)local_508,0x838100,RVar36,iVar43);
      }
      else {
        pcStack_540 = (code *)0x146fa4;
        emit_rmro((ASMState *)local_508,XO_LEA,RVar36,RVar24,iVar43);
      }
    }
    uVar46 = local_530;
    iVar45 = (local_42c & 0x1f) * 4 + (int)((MCode **)(local_508._152_8_ + 0x680))[local_42c >> 5];
    bVar57 = 0x85;
    iVar25 = (int)local_508._128_8_;
    if (local_508._128_8_ == local_3c8._0_8_) {
      local_44c = 1;
      *(int *)(local_508._128_8_ + 1) = (iVar45 - iVar25) + -5;
      if (local_3b8 == (SnapEntry *)0x0) {
        bVar57 = 0x84;
        iVar45 = iVar25;
        goto LAB_001478be;
      }
      bVar41 = 0x74;
      lVar38 = -2;
      lVar63 = -1;
      bVar57 = 0;
    }
    else {
LAB_001478be:
      *(int *)(local_508._128_8_ + -4) = iVar45 - iVar25;
      bVar41 = 0xf;
      lVar38 = -6;
      lVar63 = -5;
    }
    *(byte *)(local_508._128_8_ + lVar63) = bVar57;
    pSVar53 = (SnapEntry *)(local_508._128_8_ + lVar38);
    *(byte *)(local_508._128_8_ + lVar38) = bVar41;
    bVar57 = *(byte *)(uVar18 + local_530 * 8 + 4) & 0x1f;
    if (bVar57 < 3) {
      local_508._128_8_ = (long)pSVar53 + -1;
      *(byte *)((long)pSVar53 + -1) = ~bVar57;
      pcStack_540 = (code *)0x14791c;
      emit_rmro((ASMState *)local_508,XO_ARITHi8,7,RVar24,iVar43 + 0xc);
    }
    else {
      pcStack_540 = (code *)0x14793b;
      local_508._128_8_ = pSVar53;
      RVar36 = ra_scratch((ASMState *)local_508,~(1 << (bVar22 & 0x1f)) & 0xffef);
      pcStack_540 = (code *)0x14795b;
      emit_rmro((ASMState *)local_508,XO_CMP,RVar36 | 0x80200,RVar24,iVar43 + 8);
      bVar22 = *(byte *)(uVar18 + uVar46 * 8 + 4) & 0x1f;
      if (bVar22 == 0xe) {
        IVar49 = *(IRIns *)(uVar18 + (uVar46 + 1) * 8);
      }
      else {
        IVar49 = (IRIns)(long)CONCAT14(~bVar22,(((IRIns *)(uVar18 + uVar46 * 8))->field_1).op12);
      }
      pcStack_540 = (code *)0x14798b;
      emit_loadu64((ASMState *)local_508,RVar36,(uint64_t)IVar49);
    }
    goto switchD_001448dc_caseD_c;
  case ':':
    pcStack_540 = (code *)0x145e66;
    asm_href((ASMState *)local_508,pIVar47,IR_LT);
    goto switchD_001448dc_caseD_c;
  case ';':
    if ((pIVar47->field_1).r != 0xfe) {
      pcStack_540 = (code *)0x1450fa;
      asm_snap_prep((ASMState *)local_508);
      local_138[0].func._0_4_ = 0x7fff;
      local_138[0].func._4_4_ = (uint)(pIVar47->field_0).op1;
      local_138[0].flags = 0x7ffd;
      pcStack_540 = (code *)0x14512e;
      asm_setupresult((ASMState *)local_508,pIVar47,lj_ir_callinfo + 0x1d);
      pcStack_540 = (code *)0x14513c;
      asm_gencall((ASMState *)local_508,lj_ir_callinfo + 0x1d,(IRRef *)local_138);
      RVar36 = (Reg)*(byte *)(local_508._144_8_ + 0x3ffee);
      iVar43 = 1 << (*(byte *)(local_508._144_8_ + 0x3ffee) & 0x1f);
      stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
      *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
      IVar44 = (IRRef)(pIVar47->field_0).op2;
      goto LAB_00146df9;
    }
    goto switchD_001448dc_caseD_c;
  case '<':
  case '=':
    pcStack_540 = (code *)0x144abd;
    RVar36 = ra_dest((ASMState *)local_508,pIVar47,0xffef);
    if ((long)(short)(pIVar47->field_0).op1 < 0) {
      pcStack_540 = (code *)0x145f0a;
      RVar24 = ra_scratch((ASMState *)local_508,0xffef);
      cVar5 = *(char *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op1 * 8 + 6);
      rb = (Reg)cVar5;
      if (cVar5 < '\0') {
        pcStack_540 = (code *)0x145f31;
        rb = ra_allocref((ASMState *)local_508,(uint)(pIVar47->field_0).op1,0xffef);
      }
      bVar22 = (byte)rb & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22);
      if ((pIVar47->field_1).o == '=') {
        pcStack_540 = (code *)0x145f6c;
        emit_rmro((ASMState *)local_508,XO_LEA,RVar36,RVar24,8);
        iVar43 = (local_42c & 0x1f) * 4 +
                 (int)((MCode **)(local_508._152_8_ + 0x680))[local_42c >> 5];
        bVar22 = 0x85;
        iVar45 = (int)local_508._128_8_;
        if (local_508._128_8_ == local_3c8._0_8_) {
          local_44c = 1;
          *(int *)(local_508._128_8_ + 1) = (iVar43 - iVar45) + -5;
          if (local_3b8 == (SnapEntry *)0x0) {
            bVar22 = 0x84;
            iVar43 = iVar45;
            goto LAB_00145fa3;
          }
          bVar57 = 0x74;
          lVar38 = -2;
          lVar63 = -1;
          bVar22 = 0;
        }
        else {
LAB_00145fa3:
          *(int *)(local_508._128_8_ + -4) = iVar43 - iVar45;
          bVar57 = 0xf;
          lVar38 = -6;
          lVar63 = -5;
        }
        *(byte *)(local_508._128_8_ + lVar63) = bVar22;
        pbVar32 = (byte *)(local_508._128_8_ + lVar38);
        local_508._128_8_ = pbVar32 + -1;
        *pbVar32 = bVar57;
        *(byte *)local_508._128_8_ = 1;
        xVar68 = XO_ARITHib;
        RVar36 = 7;
        iVar66 = 6;
      }
      else {
        xVar68 = XO_MOV;
        iVar66 = 0x10;
      }
      pcStack_540 = (code *)0x1467e9;
      emit_rmro((ASMState *)local_508,xVar68,RVar36,RVar24,iVar66);
      pcStack_540 = (code *)0x146809;
      emit_rmro((ASMState *)local_508,XO_MOV,RVar24,rb,
                (uint)*(byte *)((long)&(pIVar47->field_0).op2 + 1) * 4 + 0x14);
    }
    else {
      *(SnapEntry *)(local_508._128_8_ + -4) =
           *(int *)((ulong)(((IRIns *)(local_508._144_8_ + (long)(short)(pIVar47->field_0).op1 * 8))
                           ->field_1).op12 + 0x14 +
                   (ulong)*(byte *)((long)&(pIVar47->field_0).op2 + 1) * 4) + 0x10;
      *(byte *)(local_508._128_8_ + -5) = 0x25;
      *(byte *)(local_508._128_8_ + -6) = (char)RVar36 * '\b' & 0x38U | 4;
      *(byte *)(local_508._128_8_ + -7) = 0x8b;
      if ((RVar36 & 8) == 0) {
        local_508._128_8_ = local_508._128_8_ + -7;
      }
      else {
        *(byte *)(local_508._128_8_ + -8) = 0x44;
        local_508._128_8_ = local_508._128_8_ + -8;
      }
LAB_0014781f:
    }
    goto switchD_001448dc_caseD_c;
  case '>':
    pcStack_540 = (code *)0x144ea0;
    RVar36 = ra_dest((ASMState *)local_508,pIVar47,0xffef);
    pcStack_540 = (code *)0x144eb3;
    asm_fusefref((ASMState *)local_508,pIVar47,0xffef);
    xVar68 = XO_LEA;
    break;
  case '?':
    pcStack_540 = (code *)0x144ed8;
    RVar36 = ra_dest((ASMState *)local_508,pIVar47,0xffef);
    pcStack_540 = (code *)0x144eea;
    asm_fusestrref((ASMState *)local_508,pIVar47,0xffef);
    if (local_508[0xa4] == 0x80) {
      pcStack_540 = (code *)0x144f0f;
      emit_loadi((ASMState *)local_508,RVar36,local_508._160_4_);
      goto switchD_001448dc_caseD_c;
    }
    xVar68 = XO_LEA;
    break;
  case '@':
    pcStack_540 = (code *)0x145c2d;
    RVar36 = ra_dest((ASMState *)local_508,pIVar47,0xffef);
    pcStack_540 = (code *)0x145c3c;
    ra_left((ASMState *)local_508,RVar36,0x7fff);
    goto switchD_001448dc_caseD_c;
  case 'A':
  case 'B':
  case 'C':
  case 'G':
    bVar22 = (pIVar47->field_1).t.irt & 0x1f;
    if (bVar22 == 3) {
      pcStack_540 = (code *)0x14490f;
      RVar36 = asm_load_lightud64((ASMState *)local_508,pIVar47,1);
      if (0x7f < RVar36) goto switchD_001448dc_caseD_c;
      if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
      pcStack_540 = (code *)0x144946;
      asm_fuseahuref((ASMState *)local_508,(uint)(pIVar47->field_0).op1,0xffef);
      RVar36 = RVar36 | 0x80200;
      xVar68 = XO_MOV;
    }
    else {
      if (((char)(pIVar47->field_1).r < '\0') && ((pIVar47->field_1).s == '\0')) {
        pcStack_540 = (code *)0x146bf5;
        asm_fuseahuref((ASMState *)local_508,(uint)(pIVar47->field_0).op1,0xffef);
      }
      else {
        RVar52 = 0xffff0000;
        if (bVar22 != 0xe) {
          RVar52 = 0xffef;
        }
        pcStack_540 = (code *)0x144bad;
        RVar36 = ra_dest((ASMState *)local_508,pIVar47,RVar52);
        pcStack_540 = (code *)0x144bc1;
        asm_fuseahuref((ASMState *)local_508,(uint)(pIVar47->field_0).op1,0xffef);
        xVar68 = XO_MOVSD;
        if (RVar36 < 0x10) {
          xVar68 = XO_MOV;
        }
        pcStack_540 = (code *)0x144be2;
        emit_mrm((ASMState *)local_508,xVar68,RVar36,0x20);
      }
      local_508._160_4_ = local_508._160_4_ + 4;
      pcStack_540 = (code *)0x144c06;
      asm_guardcc((ASMState *)local_508,(uint)(((pIVar47->field_1).t.irt & 0x1f) != 0xe) * 2 + 3);
      bVar22 = (pIVar47->field_1).t.irt & 0x1f;
      if (bVar22 < 0xe) {
        *(byte *)(local_508._128_8_ + -1) = ~bVar22;
        xVar68 = XO_ARITHi8;
        local_508._128_8_ = (SnapEntry *)(local_508._128_8_ + -1);
      }
      else {
        if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
        *(SnapEntry *)(local_508._128_8_ + -4) = 0xfffeffff;
        xVar68 = XO_ARITHi;
        local_508._128_8_ = (SnapEntry *)(local_508._128_8_ + -4);
      }
      RVar36 = 7;
    }
    break;
  case 'D':
  case 'E':
    pcStack_540 = (code *)0x144b3a;
    asm_fxload((ASMState *)local_508,pIVar47);
    goto switchD_001448dc_caseD_c;
  case 'F':
    uVar72 = (pIVar47->field_0).op2;
    iVar43 = ((uint)uVar72 + (uint)uVar72 & 4) + (uint)(pIVar47->field_0).op1 * 8;
    iVar66 = iVar43 + -8;
    bVar22 = (byte)(pIVar47->field_0).ot;
    if (((bVar22 & 0x9f) == 0x93 & (byte)(uVar72 >> 3) & 0x1f) == 1) {
      pcStack_540 = (code *)0x145480;
      RVar36 = ra_scratch((ASMState *)local_508,0xffff0000);
      pcStack_540 = (code *)0x145490;
      asm_tointg((ASMState *)local_508,pIVar47,RVar36);
      RVar24 = (Reg)*(char *)(local_508._144_8_ + 0x40006);
      if ((int)RVar24 < 0) {
        pcStack_540 = (code *)0x1454b6;
        RVar24 = ra_allocref((ASMState *)local_508,0x8000,0xffef);
      }
      bVar22 = (byte)RVar24 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22);
      pcStack_540 = (code *)0x1454de;
      emit_rmro((ASMState *)local_508,XO_MOVSD,RVar36,RVar24,iVar66);
      bVar22 = 0xe;
    }
    else {
      bVar57 = bVar22 & 0x1f;
      if (bVar57 == 3) {
        pcStack_540 = (code *)0x146221;
        RVar36 = asm_load_lightud64((ASMState *)local_508,pIVar47,uVar72 & 4);
        if (0x7f < RVar36) goto switchD_001448dc_caseD_c;
        RVar24 = (Reg)*(char *)(local_508._144_8_ + 0x40006);
        if (*(char *)(local_508._144_8_ + 0x40006) < '\0') {
          pcStack_540 = (code *)0x146253;
          RVar24 = ra_allocref((ASMState *)local_508,0x8000,0xffef);
        }
        bVar22 = (byte)RVar24 & 0x1f;
        uStack_458 = uStack_458 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22);
        RVar36 = RVar36 | 0x80200;
        xVar68 = XO_MOV;
        goto LAB_0014724f;
      }
      if (((char)(pIVar47->field_1).r < '\0') && ((pIVar47->field_1).s == '\0')) {
        if ((uVar72 & 4) != 0) {
          RVar24 = (Reg)*(char *)(local_508._144_8_ + 0x40006);
          if ((int)RVar24 < 0) {
            pcStack_540 = (code *)0x14785c;
            RVar24 = ra_allocref((ASMState *)local_508,0x8000,0xffef);
          }
          bVar57 = (byte)RVar24 & 0x1f;
          uStack_458 = uStack_458 & (-2 << bVar57 | 0xfffffffeU >> 0x20 - bVar57);
          goto LAB_001471ca;
        }
        goto switchD_001448dc_caseD_c;
      }
      RVar52 = 0xffef;
      if (bVar57 == 0xe) {
        RVar52 = 0xffff0000;
      }
      pcStack_540 = (code *)0x146c5d;
      RVar36 = ra_dest((ASMState *)local_508,pIVar47,RVar52);
      RVar24 = (Reg)*(char *)(local_508._144_8_ + 0x40006);
      if ((int)RVar24 < 0) {
        pcStack_540 = (code *)0x146c86;
        RVar24 = ra_allocref((ASMState *)local_508,0x8000,0xffef);
      }
      bVar41 = (byte)RVar24 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar41 | 0xfffffffeU >> 0x20 - bVar41);
      if (((pIVar47->field_0).op2 & 8) == 0) {
        xVar68 = XO_MOV;
        if (bVar57 == 0xe) {
          xVar68 = XO_MOVSD;
        }
      }
      else {
        bVar22 = (bVar57 != 0x13) * '\x05' + 0xe;
        xVar68 = (uint)(bVar57 == 0x13) * 0x2000000 + XO_CVTSI2SD;
      }
      pcStack_540 = (code *)0x1471ca;
      emit_rmro((ASMState *)local_508,xVar68,RVar36,RVar24,iVar66);
    }
LAB_001471ca:
    if (((pIVar47->field_0).op2 & 4) == 0) goto switchD_001448dc_caseD_c;
    bVar22 = bVar22 & 0x1f;
    pcStack_540 = (code *)0x1471f2;
    asm_guardcc((ASMState *)local_508,(uint)(bVar22 != 0xe) * 2 + 3);
    if (bVar22 < 0xe) {
      *(byte *)(local_508._128_8_ + -1) = ~bVar22;
      xVar68 = XO_ARITHi8;
      local_508._128_8_ = (SnapEntry *)(local_508._128_8_ + -1);
    }
    else {
      *(SnapEntry *)(local_508._128_8_ + -4) = 0xfffeffff;
      xVar68 = XO_ARITHi;
      local_508._128_8_ = (SnapEntry *)(local_508._128_8_ + -4);
    }
    iVar66 = iVar43 + -4;
    RVar36 = 7;
LAB_0014724f:
    pcStack_540 = (code *)0x147257;
    emit_rmro((ASMState *)local_508,xVar68,RVar36,RVar24,iVar66);
    goto switchD_001448dc_caseD_c;
  case 'H':
  case 'I':
  case 'J':
    if ((pIVar47->field_1).r == 0xfe) goto switchD_001448dc_caseD_c;
    bVar22 = (pIVar47->field_1).t.irt & 0x1f;
    if (bVar22 == 3) {
      cVar5 = *(char *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op2 * 8 + 6);
      RVar36 = (Reg)cVar5;
      if (cVar5 < '\0') {
        pcStack_540 = (code *)0x1465d4;
        RVar36 = ra_allocref((ASMState *)local_508,(uint)(pIVar47->field_0).op2,0xffef);
      }
      bVar22 = (byte)RVar36 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22);
      pcStack_540 = (code *)0x1465ff;
      asm_fuseahuref((ASMState *)local_508,(uint)(pIVar47->field_0).op1,
                     ~(1 << (RVar36 & 0x1f)) & 0xffef);
      RVar36 = RVar36 | 0x80200;
      xVar68 = XO_MOVto;
    }
    else if (bVar22 == 0xe) {
      RVar36 = (Reg)*(char *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op2 * 8 + 6);
      if ((int)RVar36 < 0) {
        pcStack_540 = (code *)0x1449a0;
        RVar36 = ra_allocref((ASMState *)local_508,(uint)(pIVar47->field_0).op2,0xffff0000);
      }
      bVar22 = (byte)RVar36 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22);
      pcStack_540 = (code *)0x1449c8;
      asm_fuseahuref((ASMState *)local_508,(uint)(pIVar47->field_0).op1,0xffef);
      xVar68 = XO_MOVSDto;
    }
    else {
      uVar72 = (pIVar47->field_0).op2;
      uVar46 = (ulong)uVar72;
      if ((short)uVar72 < 0) {
        cVar5 = *(char *)(local_508._144_8_ + uVar46 * 8 + 6);
        RVar36 = (Reg)cVar5;
        if (cVar5 < '\0') {
          pcStack_540 = (code *)0x146ea8;
          RVar36 = ra_allocref((ASMState *)local_508,(uint)uVar72,0xffef);
        }
        bVar22 = (byte)RVar36 & 0x1f;
        uStack_458 = uStack_458 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22);
        pcStack_540 = (code *)0x146ed2;
        asm_fuseahuref((ASMState *)local_508,(uint)(pIVar47->field_0).op1,
                       ~(1 << (RVar36 & 0x1f)) & 0xffef);
        if (0x7f < RVar36) goto LAB_00146ee7;
        xVar68 = XO_MOVto;
LAB_00146f17:
        pcStack_540 = (code *)0x146f21;
        emit_mrm((ASMState *)local_508,xVar68,RVar36,0x20);
      }
      else {
        pcStack_540 = (code *)0x14669c;
        asm_fuseahuref((ASMState *)local_508,(uint)(pIVar47->field_0).op1,0xffef);
LAB_00146ee7:
        if (2 < (*(byte *)(uVar18 + uVar46 * 8 + 4) & 0x1f)) {
          *(IRRef2 *)(local_508._128_8_ + -4) = (((IRIns *)(uVar18 + uVar46 * 8))->field_1).op12;
          local_508._128_8_ = local_508._128_8_ + -4;
          xVar68 = XO_MOVmi;
          RVar36 = 0;
          goto LAB_00146f17;
        }
      }
      local_508._160_4_ = local_508._160_4_ + 4;
      *(int *)(local_508._128_8_ + -4) = (int)(char)(~(pIVar47->field_1).t.irt | 0xe0);
      local_508._128_8_ = local_508._128_8_ + -4;
      xVar68 = XO_MOVmi;
      RVar36 = 0;
    }
    break;
  case 'K':
  case 'L':
    pcStack_540 = (code *)0x144b28;
    asm_fxstore((ASMState *)local_508,pIVar47);
    goto switchD_001448dc_caseD_c;
  case 'M':
  case 'N':
    pcStack_540 = (code *)0x144a77;
    asm_snap_prep((ASMState *)local_508);
    aVar4 = pIVar47->field_0;
    auVar9._8_4_ = 0;
    auVar9._0_2_ = aVar4.op1;
    auVar9._2_2_ = aVar4.op2;
    auVar9._4_2_ = aVar4.ot;
    auVar9._6_2_ = aVar4.prev;
    auVar9._12_2_ = aVar4.prev;
    auVar12._8_2_ = aVar4.ot;
    auVar12._0_2_ = aVar4.op1;
    auVar12._2_2_ = aVar4.op2;
    auVar12._4_2_ = aVar4.ot;
    auVar12._6_2_ = aVar4.prev;
    auVar12._10_4_ = auVar9._10_4_;
    auVar15._6_8_ = 0;
    auVar15._0_6_ = auVar12._8_6_;
    IVar58 = aVar4.op1;
    local_138[0].flags = (uint32_t)CONCAT82(SUB148(auVar15 << 0x40,6),aVar4.op2);
    local_400._4_4_ = local_400._4_4_ + 1;
    pCVar55 = lj_ir_callinfo + 2;
    goto LAB_00144d7b;
  case 'O':
    pcStack_540 = (code *)0x1452b4;
    asm_snap_prep((ASMState *)local_508);
    local_138[0].func._0_4_ = 0x7fff;
    local_138[0].func._4_4_ = 0x7ffd;
    local_400._4_4_ = local_400._4_4_ + 1;
    pcStack_540 = (code *)0x1452e4;
    asm_setupresult((ASMState *)local_508,pIVar47,lj_ir_callinfo + 0x1a);
    pcStack_540 = (code *)0x1452f2;
    asm_gencall((ASMState *)local_508,lj_ir_callinfo + 0x1a,(IRRef *)local_138);
    RVar36 = (Reg)*(byte *)(local_508._144_8_ + 0x3ffee);
    iVar43 = 1 << (*(byte *)(local_508._144_8_ + 0x3ffee) & 0x1f);
    stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
    *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
    uVar56 = (uint)(pIVar47->field_0).op2 << 0x18 | (uint)(pIVar47->field_0).op1;
    goto LAB_00147097;
  case 'P':
    pcStack_540 = (code *)0x144d57;
    asm_snap_prep((ASMState *)local_508);
    IVar58 = (pIVar47->field_0).op1;
    local_400._4_4_ = local_400._4_4_ + 1;
    pCVar55 = lj_ir_callinfo + 0x1b;
LAB_00144d7b:
    local_138[0].func._4_4_ = (uint)IVar58;
    local_138[0].func._0_4_ = 0x7fff;
    pcStack_540 = (code *)0x144d89;
    asm_setupresult((ASMState *)local_508,pIVar47,pCVar55);
    pcStack_540 = (code *)0x144d97;
    asm_gencall((ASMState *)local_508,pCVar55,(IRRef *)local_138);
    goto switchD_001448dc_caseD_c;
  case 'Q':
  case 'R':
    id = (((IRIns *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op1 * 8))->field_1).op12;
    pcStack_540 = (code *)0x144a04;
    CVar23 = lj_ctype_info((CTState *)
                           (ulong)((jit_State *)(local_508._152_8_ + -0xa20))->bpropcache[0xc].mode,
                           id,(CTSize *)&local_168.i);
    local_400._4_4_ = local_400._4_4_ + 1;
    pcStack_540 = (code *)0x144a20;
    asm_setupresult((ASMState *)local_508,pIVar47,lj_ir_callinfo + 0x21);
    if ((pIVar47->field_1).o == 'R') {
      uVar56 = 0x80200;
      if (local_168.field_1.op12 != 8) {
        uVar56 = 0;
      }
      uVar72 = (pIVar47->field_0).op2;
      uVar46 = (ulong)uVar72;
      bVar22 = (byte)(uVar56 >> 0x10);
      if ((short)uVar72 < 0) {
        cVar5 = *(char *)(local_508._144_8_ + uVar46 * 8 + 6);
        RVar36 = (Reg)cVar5;
        if (cVar5 < '\0') {
          pcStack_540 = (code *)0x14676f;
          RVar36 = ra_allocref((ASMState *)local_508,(uint)uVar72,0xf028);
        }
        bVar57 = (byte)RVar36 & 0x1f;
        uStack_458 = uStack_458 & (-2 << bVar57 | 0xfffffffeU >> 0x20 - bVar57);
        *(byte *)(local_508._128_8_ + -1) = 8;
        *(byte *)(local_508._128_8_ + -2) = (byte)RVar36 * '\b' & 0x38 | 0x40;
        *(byte *)(local_508._128_8_ + -3) = 0x89;
        uVar56 = (RVar36 | uVar56) >> 1 & 0x104;
        if (uVar56 == 0) {
          local_508._128_8_ = local_508._128_8_ + -3;
        }
        else {
          *(byte *)(local_508._128_8_ + -4) = (byte)uVar56 | bVar22 | 0x40;
          local_508._128_8_ = local_508._128_8_ + -4;
        }
      }
      else {
        if (*(char *)(local_508._144_8_ + uVar46 * 8 + 5) == '\x1d') {
          IVar49 = *(IRIns *)(local_508._144_8_ + (uVar46 + 1) * 8);
        }
        else {
          IVar49._4_4_ = 0;
          IVar49.field_1.op12 = (((IRIns *)(local_508._144_8_ + uVar46 * 8))->field_1).op12;
        }
        if ((local_168.field_1.op12 == 4) || ((long)IVar49 + 0x80000000U >> 0x20 == 0)) {
          *(int32_t *)(local_508._128_8_ + -4) = IVar49.i;
          *(byte *)(local_508._128_8_ + -5) = 8;
          ((byte *)(local_508._128_8_ + -7))[0] = 199;
          ((byte *)(local_508._128_8_ + -7))[1] = 0x40;
          if ((uVar56 >> 9 & 1) == 0) {
            local_508._128_8_ = local_508._128_8_ + -7;
          }
          else {
            *(byte *)(local_508._128_8_ + -8) = bVar22 | 0x40;
            local_508._128_8_ = local_508._128_8_ + -8;
          }
        }
        else {
          *(byte *)(local_508._128_8_ + -1) = 8;
          ((byte *)(local_508._128_8_ + -3))[0] = 0x89;
          ((byte *)(local_508._128_8_ + -3))[1] = 0x48;
          if ((uVar56 >> 9 & 1) == 0) {
            local_508._128_8_ = local_508._128_8_ + -3;
          }
          else {
            *(byte *)(local_508._128_8_ + -4) = bVar22 | 0x40;
            local_508._128_8_ = local_508._128_8_ + -4;
          }
          pcStack_540 = (code *)0x146f90;
          emit_loadu64((ASMState *)local_508,1,(uint64_t)IVar49);
        }
      }
    }
    else if ((pIVar47->field_0).op2 != 0x7fff) {
      local_138[0].func._0_4_ = 0x7fff;
      local_138[0].func._4_4_ = (uint)(pIVar47->field_0).op1;
      local_138[0]._12_4_ = 0x7ffd;
      pcStack_540 = (code *)0x144f9c;
      local_138[0].flags = (uint)(pIVar47->field_0).op2;
      asm_gencall((ASMState *)local_508,lj_ir_callinfo + 0x5c,(IRRef *)local_138);
      bVar22 = *(byte *)(local_508._144_8_ + 0x3ffee);
      iVar43 = 1 << (bVar22 & 0x1f);
      stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
      *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
      pcStack_540 = (code *)0x144fea;
      emit_loadi((ASMState *)local_508,(uint)bVar22,CVar23 >> 0x10 & 0xf);
      goto switchD_001448dc_caseD_c;
    }
    *(byte *)(local_508._128_8_ + -1) = 1;
    *(int *)(local_508._128_8_ + -5) = local_508._152_4_ + -0x168;
    ((byte *)(local_508._128_8_ + -7))[0] = 4;
    ((byte *)(local_508._128_8_ + -7))[1] = 0x25;
    pbVar32 = (byte *)(local_508._128_8_ + -0xb);
    pbVar32[0] = 0x89;
    pbVar32[1] = 0x48;
    pbVar32[2] = 4;
    pbVar32[3] = 0x83;
    *(CTypeID *)(local_508._128_8_ + -0xf) = id << 0x10 | 0xa00;
    *(byte *)(local_508._128_8_ + -0x10) = 0xc9;
    *(SnapEntry *)(local_508._128_8_ + -0x14) = 0x8103e183;
    *(SnapEntry *)(local_508._128_8_ + -0x18) = local_508._152_4_ - 0x1f0;
    *(SnapEntry *)(local_508._128_8_ + -0x1c) = 0x250cb60f;
    local_508._128_8_ = local_508._128_8_ + -0x1c;
    local_138[0].func._0_4_ = 0x7fff;
    local_138[0].func._4_4_ = 0x7ffd;
    pcStack_540 = (code *)0x14704f;
    asm_gencall((ASMState *)local_508,lj_ir_callinfo + 0x21,(IRRef *)local_138);
    RVar36 = (Reg)*(byte *)(local_508._144_8_ + 0x3ffee);
    iVar43 = 1 << (*(byte *)(local_508._144_8_ + 0x3ffee) & 0x1f);
    stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
    *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
    uVar56 = local_168.field_1.op12 + 8;
LAB_00147097:
    pcStack_540 = (code *)0x14709e;
    emit_loadi((ASMState *)local_508,RVar36,uVar56);
    goto switchD_001448dc_caseD_c;
  case 'S':
    pcStack_540 = (code *)0x144e3b;
    RVar36 = ra_dest((ASMState *)local_508,pIVar47,0xffef);
    if (((pIVar47->field_0).op2 & 1) == 0) {
      pcStack_540 = (code *)0x144e5b;
      RVar24 = ra_scratch((ASMState *)local_508,~(1 << (RVar36 & 0x1f)) & 0xffef);
      pcStack_540 = (code *)0x144e70;
      emit_storeofs((ASMState *)local_508,pIVar47,RVar24,RVar36,0);
      pcStack_540 = (code *)0x144e86;
      emit_loadofs((ASMState *)local_508,pIVar47,RVar24,RVar36,8);
    }
    else {
      uVar72 = (pIVar47->field_0).op1;
      if (((*(char *)(local_508._144_8_ + (ulong)uVar72 * 8 + 6) < '\0') &&
          (pIVar29 = (IRIns *)(local_508._144_8_ + (ulong)uVar72 * 8), pIVar29 != pIVar47 + -1)) &&
         ((pIVar29 != pIVar47 + -2 ||
          ((-1 < *(char *)((long)pIVar47 + -2) || (*(char *)((long)pIVar47 + -1) != '\0')))))) {
        for (; ((pIVar29->field_1).o != 'S' || (((pIVar29->field_0).op2 & 1) != 0));
            pIVar29 = (IRIns *)(local_508._144_8_ + (ulong)(pIVar29->field_0).op1 * 8)) {
        }
        if (-1 < (short)(pIVar29->field_0).op1) {
          pcStack_540 = (code *)0x14605d;
          RVar24 = ra_allocref((ASMState *)local_508,(uint)uVar72,0xffef);
          uStack_458 = uStack_458 | 1 << ((byte)RVar24 & 0x1f);
          pIVar47 = pIVar29;
        }
      }
    }
    pcStack_540 = (code *)0x146080;
    ra_left((ASMState *)local_508,RVar36,(uint)(pIVar47->field_0).op1);
    goto switchD_001448dc_caseD_c;
  case 'T':
    local_138[0].func._0_4_ = (uint)(pIVar47->field_0).op1;
    uVar46 = (ulong)(pIVar47->field_0).op2;
    local_138[0].func._4_4_ = (uint)(pIVar47->field_0).op2;
    cVar5 = *(char *)(local_508._144_8_ + uVar46 * 8 + 5);
    if (cVar5 == '\x18') {
      if (*(int *)((ulong)(((IRIns *)(local_508._144_8_ + uVar46 * 8))->field_1).op12 + 0xc) == 1) {
        local_530 = CONCAT44(local_530._4_4_,
                             (int)*(char *)((ulong)(((IRIns *)(local_508._144_8_ + uVar46 * 8))->
                                                   field_1).op12 + 0x10));
        pCVar55 = lj_ir_callinfo + 0x12;
LAB_00145eee:
        local_138[0].func._4_4_ = 0x7ffd;
        uVar67 = 0x7ffd;
        goto LAB_00146d74;
      }
LAB_00146d69:
      pCVar55 = lj_ir_callinfo + 0x11;
      local_530 = CONCAT44(local_530._4_4_,0xffffff7f);
      uVar67 = uVar46;
    }
    else {
      if ((local_138[0].func._4_4_ <= local_40c) ||
         (-1 < *(char *)(local_508._144_8_ + uVar46 * 8 + 6))) goto LAB_00146d69;
      if (cVar5 == 'M') {
        local_530 = CONCAT44(local_530._4_4_,0xffffff7f);
        uVar67 = (ulong)(((IRIns *)(local_508._144_8_ + uVar46 * 8))->field_0).op1;
        local_138[0].func._4_4_ = (uint)(((IRIns *)(local_508._144_8_ + uVar46 * 8))->field_0).op1;
        local_138[0].flags = (uint32_t)*(ushort *)(local_508._144_8_ + uVar46 * 8 + 2);
        pCVar55 = lj_ir_callinfo + 0x10;
      }
      else {
        if (cVar5 != '[') goto LAB_00146d69;
        sVar7 = *(short *)(local_508._144_8_ + uVar46 * 8 + 2);
        if (sVar7 == 1) {
          local_530 = CONCAT44(local_530._4_4_,0xffffff7f);
          pCVar55 = lj_ir_callinfo + 8;
          goto LAB_00145eee;
        }
        local_530 = CONCAT44(local_530._4_4_,0xffffff7f);
        uVar67 = (ulong)(((IRIns *)(local_508._144_8_ + uVar46 * 8))->field_0).op1;
        local_138[0].func._4_4_ = (uint)(((IRIns *)(local_508._144_8_ + uVar46 * 8))->field_0).op1;
        pCVar55 = lj_ir_callinfo + 0x12;
        if (sVar7 == 0) {
          pCVar55 = lj_ir_callinfo + 7;
        }
      }
    }
LAB_00146d74:
    pcStack_540 = (code *)0x146d87;
    asm_setupresult((ASMState *)local_508,pIVar47,pCVar55);
    pcStack_540 = (code *)0x146d9a;
    asm_gencall((ASMState *)local_508,pCVar55,(IRRef *)local_138);
    if ((int)uVar67 == 0x7ffd) {
      RVar36 = (Reg)*(byte *)(local_508._144_8_ + 0x3ffee);
      iVar43 = 1 << (*(byte *)(local_508._144_8_ + 0x3ffee) & 0x1f);
      stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
      *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
      uVar56 = (uint)local_530;
      if ((uint)local_530 != 0xffffff7f) goto LAB_00147097;
      IVar44 = (IRRef)(((IRIns *)(uVar18 + uVar46 * 8))->field_0).op1;
      goto LAB_00146df9;
    }
    goto switchD_001448dc_caseD_c;
  case 'U':
    local_138[0].func._0_4_ = (uint)(pIVar47->field_0).op1;
    local_400._4_4_ = local_400._4_4_ + 1;
    pcStack_540 = (code *)0x144dcb;
    asm_setupresult((ASMState *)local_508,pIVar47,lj_ir_callinfo + 0x18);
    pCVar55 = lj_ir_callinfo + 0x18;
LAB_0014597f:
    pcStack_540 = (code *)0x145987;
    asm_gencall((ASMState *)local_508,pCVar55,(IRRef *)local_138);
    goto switchD_001448dc_caseD_c;
  case 'V':
    uVar56 = (uint)*(char *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op1 * 8 + 6);
    if ((int)uVar56 < 0) {
      pcStack_540 = (code *)0x145a26;
      uVar56 = ra_allocref((ASMState *)local_508,(uint)(pIVar47->field_0).op1,0xffef);
    }
    bVar22 = (byte)uVar56 & 0x1f;
    uStack_458 = uStack_458 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22);
    pcStack_540 = (code *)0x145a4d;
    RVar36 = ra_scratch((ASMState *)local_508,~(1 << (uVar56 & 0x1f)) & 0xffef);
    uVar18 = local_508._128_8_;
    pcStack_540 = (code *)0x145a6e;
    emit_rmro((ASMState *)local_508,XO_MOVto,RVar36,uVar56,0xc);
    *(SnapEntry *)(local_508._128_8_ + -4) = local_508._152_4_ - 0x1dc;
    *(byte *)(local_508._128_8_ + -5) = 0x25;
    *(byte *)(local_508._128_8_ + -6) = (byte)uVar56 * '\b' & 0x38 | 4;
    *(byte *)(local_508._128_8_ + -7) = 0x89;
    if ((uVar56 & 8) == 0) {
      local_508._128_8_ = local_508._128_8_ + -7;
    }
    else {
      *(byte *)(local_508._128_8_ + -8) = 0x44;
      local_508._128_8_ = local_508._128_8_ + -8;
    }
    *(SnapEntry *)(local_508._128_8_ + -4) = local_508._152_4_ - 0x1dc;
    *(byte *)(local_508._128_8_ + -5) = 0x25;
    *(byte *)(local_508._128_8_ + -6) = (char)RVar36 * '\b' & 0x38U | 4;
    *(byte *)(local_508._128_8_ + -7) = 0x8b;
    lVar38 = -7;
    if ((RVar36 & 8) != 0) {
      *(byte *)(local_508._128_8_ + -8) = 0x44;
      lVar38 = -8;
    }
    local_508._128_8_ = local_508._128_8_ + lVar38 + -1;
    *(byte *)local_508._128_8_ = 0xfb;
    pcStack_540 = (code *)0x1463f5;
    emit_rmro((ASMState *)local_508,XO_ARITHib,4,uVar56,4);
    *(char *)(local_508._128_8_ + -1) = (char)uVar18 - (char)local_508._128_8_;
    *(byte *)(local_508._128_8_ + -2) = 0x74;
    *(byte *)(local_508._128_8_ + -3) = 4;
    pcStack_540 = (code *)0x14642d;
    local_508._128_8_ = (SnapEntry *)(local_508._128_8_ + -3);
    emit_rmro((ASMState *)local_508,XO_GROUP3b,0,uVar56,4);
    goto switchD_001448dc_caseD_c;
  case 'W':
    pcStack_540 = (code *)0x145ca1;
    ra_evictset((ASMState *)local_508,0xffff0fc7);
    uVar18 = local_508._128_8_;
    local_138[0].func._0_4_ = 0x7ffd;
    local_138[0].func._4_4_ = (uint)(pIVar47->field_0).op1;
    pcStack_540 = (code *)0x145ccc;
    asm_gencall((ASMState *)local_508,lj_ir_callinfo + 0x20,(IRRef *)local_138);
    bVar22 = *(byte *)(local_508._144_8_ + 0x3ffee);
    iVar43 = 1 << (bVar22 & 0x1f);
    stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
    *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
    pcStack_540 = (code *)0x145d1d;
    emit_loadi((ASMState *)local_508,(uint)bVar22,local_508._152_4_ + -0x248);
    bVar22 = *(byte *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op1 * 8 + 6);
    *(char *)(local_508._128_8_ + -1) = (char)uVar18 - (char)local_508._128_8_;
    *(byte *)(local_508._128_8_ + -2) = 0x74;
    pbVar32 = (byte *)(local_508._128_8_ + -3);
    *(byte *)(local_508._128_8_ + -3) = 3;
    uVar72 = (pIVar47->field_0).op2;
    if ((short)uVar72 < 0) {
      cVar5 = *(char *)(local_508._144_8_ + (ulong)uVar72 * 8 + 6);
      RVar36 = (Reg)cVar5;
      local_508._128_8_ = pbVar32;
      if (cVar5 < '\0') {
        pcStack_540 = (code *)0x146849;
        RVar36 = ra_allocref((ASMState *)local_508,(uint)uVar72,~(1 << (bVar22 & 0x1f)) & 0xfc7);
      }
      bVar57 = (byte)RVar36 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar57 | 0xfffffffeU >> 0x20 - bVar57);
      pcStack_540 = (code *)0x146873;
      emit_rmro((ASMState *)local_508,XO_GROUP3b,0,RVar36,4);
    }
    else {
      *(IRRef2 *)(local_508._128_8_ + -7) =
           (((IRIns *)(local_508._144_8_ + (ulong)uVar72 * 8))->field_1).op12 + 4;
      *(byte *)(local_508._128_8_ + -8) = 0x25;
      ((byte *)(local_508._128_8_ + -10))[0] = 0xf6;
      ((byte *)(local_508._128_8_ + -10))[1] = 4;
      local_508._128_8_ = local_508._128_8_ + -10;
    }
    *(char *)(local_508._128_8_ + -1) = (char)uVar18 - (char)local_508._128_8_;
    *(byte *)(local_508._128_8_ + -2) = 0x74;
    *(byte *)(local_508._128_8_ + -3) = 4;
    xVar68 = XO_GROUP3b;
    RVar36 = 0;
    uVar56 = (uint)bVar22;
    local_508._128_8_ = (SnapEntry *)(local_508._128_8_ + -3);
LAB_001468a2:
    pcStack_540 = (code *)0x1468ad;
    emit_rmro((ASMState *)local_508,xVar68,RVar36,uVar56,-4);
    goto switchD_001448dc_caseD_c;
  case 'Y':
    uVar56 = (pIVar47->field_0).op2 & 0x1f;
    uVar42 = (ushort)uVar56;
    bVar71 = (ushort)(uVar42 - 0x15) < 2;
    uVar72 = (pIVar47->field_0).op1;
    uVar46 = (ulong)uVar72;
    bVar22 = (byte)(pIVar47->field_0).ot;
    uVar50 = bVar22 & 0x1f;
    if ((byte)((char)uVar50 - 0xdU) < 2) {
      pcStack_540 = (code *)0x145ddc;
      local_530 = uVar46;
      RVar36 = ra_dest((ASMState *)local_508,pIVar47,0xffff0000);
      bVar22 = (byte)RVar36;
      IVar44 = (IRRef)local_530;
      if ((ushort)(uVar42 - 0xd) < 2) {
        pcStack_540 = (code *)0x145e0b;
        RVar24 = asm_fuseload((ASMState *)local_508,IVar44,0xffff0000);
        pcStack_540 = (code *)0x145e25;
        emit_mrm((ASMState *)local_508,(uint)(uVar42 != 0xe) << 8 | XO_CVTSD2SS,RVar36,RVar24);
        if (RVar24 == RVar36) goto switchD_001448dc_caseD_c;
      }
      else {
        uVar50 = (uint)(uVar56 == 9 || bVar71);
        if ((uVar56 | 2) == 0x16) {
          cVar5 = *(char *)(local_508._144_8_ + (local_530 & 0xffffffff) * 8 + 6);
          RVar24 = (Reg)cVar5;
          if (cVar5 < '\0') {
            pcStack_540 = (code *)0x146cf5;
            RVar24 = ra_allocref((ASMState *)local_508,IVar44,0xffef);
          }
          bVar57 = (byte)RVar24 & 0x1f;
          uStack_458 = uStack_458 & (-2 << bVar57 | 0xfffffffeU >> 0x20 - bVar57);
        }
        else {
          pcStack_540 = (code *)0x14734a;
          RVar24 = asm_fuseloadm((ASMState *)local_508,IVar44,0xffef,uVar50);
        }
        if (uVar42 == 0x16) {
          *(SnapEntry *)(local_508._128_8_ + -4) = local_508._152_4_ + 0x120;
          *(byte *)(local_508._128_8_ + -5) = 0x25;
          *(byte *)(local_508._128_8_ + -6) = bVar22 * '\b' & 0x38 | 4;
          pbVar32 = (byte *)(local_508._128_8_ + -10);
          pbVar32[0] = 0xfc;
          pbVar32[1] = 0xf2;
          pbVar32[2] = 0xf;
          pbVar32[3] = 0x58;
          pbVar32 = (byte *)(local_508._128_8_ + -9);
          if ((RVar36 & 8) != 0) {
            *pbVar32 = 0x44;
            pbVar32 = (byte *)(local_508._128_8_ + -10);
            *pbVar32 = 0xf2;
          }
          pbVar32[-1] = (char)local_508._128_8_ - (char)pbVar32;
          pbVar32[-2] = 0x79;
          pbVar32[-3] = ((byte)RVar24 & 7) + (byte)RVar24 * '\b' | 0xc0;
          pbVar32[-4] = 0x85;
          pbVar32[-5] = (byte)(RVar24 >> 0x10) | (byte)(RVar24 >> 1) & 4 | (byte)(RVar24 >> 3) & 1 |
                        0x48;
          local_508._128_8_ = pbVar32 + -5;
        }
        if (uVar56 == 9 || bVar71) {
          uVar50 = 0x80200;
        }
        if (uVar42 == 0x14) {
          uVar50 = 0x80200;
        }
        pcStack_540 = (code *)0x14741a;
        emit_mrm((ASMState *)local_508,
                 (uint)(((pIVar47->field_1).t.irt & 0x1f) != 0xe) << 8 | XO_CVTSI2SD,uVar50 | RVar36
                 ,RVar24);
      }
      *(byte *)(local_508._128_8_ + -1) = (bVar22 & 7) + bVar22 * '\b' | 0xc0;
      ((byte *)(local_508._128_8_ + -3))[0] = 0xf;
      ((byte *)(local_508._128_8_ + -3))[1] = 0x57;
      uVar56 = RVar36 >> 3 & 1 | RVar36 >> 1 & 4;
      if (uVar56 == 0) {
        local_508._128_8_ = local_508._128_8_ + -3;
      }
      else {
        *(byte *)(local_508._128_8_ + -4) = (byte)uVar56 | 0x40;
        local_508._128_8_ = local_508._128_8_ + -4;
      }
      goto LAB_0014781f;
    }
    if ((ushort)(uVar42 - 0xd) < 2) {
      if ((char)bVar22 < '\0') {
        cVar5 = *(char *)(local_508._144_8_ + uVar46 * 8 + 6);
        RVar36 = (Reg)cVar5;
        if (cVar5 < '\0') {
          pcStack_540 = (code *)0x147285;
          RVar36 = ra_allocref((ASMState *)local_508,(uint)uVar72,0xffff0000);
        }
        bVar22 = (byte)RVar36 & 0x1f;
        uStack_458 = uStack_458 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22);
        pcStack_540 = (code *)0x1472a3;
        asm_tointg((ASMState *)local_508,pIVar47,RVar36);
        goto switchD_001448dc_caseD_c;
      }
      pcStack_540 = (code *)0x14654f;
      RVar24 = ra_dest((ASMState *)local_508,pIVar47,0xffef);
      xVar68 = (uint)(uVar42 != 0xe) << 8 | XO_CVTTSD2SI;
      uVar56 = (pIVar47->field_1).t.irt & 0x1f;
      bVar22 = (byte)RVar24;
      if (uVar56 == 0x14) {
        *(byte *)(local_508._128_8_ + -1) = (bVar22 & 7) + bVar22 * '\b' | 0xc0;
        *(byte *)(local_508._128_8_ + -2) = 0x8b;
        uVar56 = RVar24 >> 3 & 1 | RVar24 >> 1 & 4;
        if (uVar56 == 0) {
          local_508._128_8_ = local_508._128_8_ + -2;
        }
        else {
          *(byte *)(local_508._128_8_ + -3) = (byte)uVar56 | 0x40;
          local_508._128_8_ = local_508._128_8_ + -3;
        }
        uVar56 = (uint)((pIVar47->field_1).t.irt & 0x1f);
      }
      else if (uVar56 == 0x16) {
        if (*(char *)(local_508._144_8_ + uVar46 * 8 + 6) < '\0') {
          pcStack_540 = (code *)0x147abf;
          RVar36 = ra_allocref((ASMState *)local_508,(uint)uVar72,0xffff0000);
          bVar57 = (byte)RVar36 & 0x1f;
          uStack_458 = uStack_458 & (-2 << bVar57 | 0xfffffffeU >> 0x20 - bVar57);
        }
        else {
          pcStack_540 = (code *)0x14659a;
          RVar36 = ra_scratch((ASMState *)local_508,0xffff0000);
        }
        local_520 = (SnapEntry *)local_508._128_8_;
        local_530 = CONCAT44(local_530._4_4_,RVar24) | 0x80200;
        pcStack_540 = (code *)0x147afb;
        emit_rr((ASMState *)local_508,xVar68,RVar24 | 0x80200,RVar36);
        bVar57 = (char)RVar36 * '\b' & 0x38U | 4;
        if (uVar42 == 0xe) {
          *(SnapEntry *)(local_508._128_8_ + -4) = (int)local_508._152_8_ + 0x128;
          *(byte *)(local_508._128_8_ + -5) = 0x25;
          *(byte *)(local_508._128_8_ + -6) = bVar57;
          pbVar32 = (byte *)(local_508._128_8_ + -10);
          pbVar32[0] = 0xfc;
          pbVar32[1] = 0xf2;
          pbVar32[2] = 0xf;
          pbVar32[3] = 0x58;
          bVar57 = 0xf2;
        }
        else {
          *(SnapEntry *)(local_508._128_8_ + -4) = (int)local_508._152_8_ + 0x130;
          *(byte *)(local_508._128_8_ + -5) = 0x25;
          *(byte *)(local_508._128_8_ + -6) = bVar57;
          pbVar32 = (byte *)(local_508._128_8_ + -10);
          pbVar32[0] = 0xfc;
          pbVar32[1] = 0xf3;
          pbVar32[2] = 0xf;
          pbVar32[3] = 0x58;
          bVar57 = 0xf3;
        }
        pbVar32 = (byte *)(local_508._128_8_ + -9);
        if ((RVar36 & 8) != 0) {
          pbVar32 = (byte *)(local_508._128_8_ + -10);
          *(byte *)(local_508._128_8_ + -9) = 0x44;
          *pbVar32 = bVar57;
        }
        pbVar32[-1] = (char)local_520 - (char)pbVar32;
        pbVar32[-2] = 0x79;
        pbVar32[-3] = (bVar22 & 7) + bVar22 * '\b' | 0xc0;
        pbVar32[-4] = 0x85;
        pbVar32[-5] = (byte)(RVar24 >> 3) & 1 | (byte)(RVar24 >> 1) & 4 | 0x48;
        local_508._128_8_ = pbVar32 + -5;
        pcStack_540 = (code *)0x147bc1;
        emit_rr((ASMState *)local_508,xVar68,(uint)local_530,RVar36);
        goto LAB_00147bc6;
      }
      uVar50 = 0;
      if ((char)uVar56 == '\x14') {
        uVar50 = 0x80200;
      }
      if ((0x604208U >> uVar56 & 1) != 0) {
        uVar50 = 0x80200;
      }
      RVar36 = uVar50 | RVar24;
      pcStack_540 = (code *)0x147c15;
      RVar24 = asm_fuseload((ASMState *)local_508,(uint)uVar72,0xffff0000);
    }
    else if ((ushort)(uVar42 - 0xf) < 4) {
      pcStack_540 = (code *)0x146d31;
      RVar36 = ra_dest((ASMState *)local_508,pIVar47,0xffef);
      if (uVar42 == 0x11) {
        xVar68 = XO_MOVSXw;
      }
      else if (uVar56 == 0x10) {
        RVar36 = RVar36 | 0x200;
        xVar68 = XO_MOVZXb;
      }
      else if (uVar56 == 0xf) {
        RVar36 = RVar36 | 0x200;
        xVar68 = XO_MOVSXb;
      }
      else {
        xVar68 = XO_MOVZXw;
      }
      pcStack_540 = (code *)0x1479be;
      RVar24 = asm_fuseload((ASMState *)local_508,(uint)uVar72,0xffef);
    }
    else {
      pcStack_540 = (code *)0x14714b;
      RVar36 = ra_dest((ASMState *)local_508,pIVar47,0xffef);
      if ((0x604208U >> uVar50 & 1) == 0) {
        if ((0x16 < uVar42) || ((0x600200U >> uVar56 & 1) == 0)) {
LAB_00147bc6:
          pcStack_540 = (code *)0x147bce;
          ra_left((ASMState *)local_508,RVar36,(uint)uVar72);
          goto switchD_001448dc_caseD_c;
        }
        pcStack_540 = (code *)0x14718b;
        RVar24 = asm_fuseload((ASMState *)local_508,(uint)uVar72,0xffef);
        xVar68 = XO_MOV;
      }
      else {
        if (((uVar42 < 0x17) && ((0x600200U >> uVar56 & 1) != 0)) ||
           (((pIVar47->field_0).op2 & 0x800) == 0)) goto LAB_00147bc6;
        pcStack_540 = (code *)0x147c48;
        RVar24 = asm_fuseload((ASMState *)local_508,(uint)uVar72,0xffef);
        RVar36 = RVar36 | 0x80200;
        xVar68 = XO_MOVSXd;
      }
    }
LAB_00147c1d:
    pcStack_540 = (code *)0x147c24;
    emit_mrm((ASMState *)local_508,xVar68,RVar36,RVar24);
    goto switchD_001448dc_caseD_c;
  case 'Z':
    pcStack_540 = (code *)0x144deb;
    RVar36 = ra_dest((ASMState *)local_508,pIVar47,0xffef);
    if (*(char *)(local_508._144_8_ + (ulong)(pIVar47->field_0).op1 * 8 + 6) < '\0') {
      pcStack_540 = (code *)0x1466b3;
      uVar56 = ra_allocref((ASMState *)local_508,(uint)(pIVar47->field_0).op1,0xffff0000);
      bVar22 = (byte)uVar56;
      uStack_458 = uStack_458 & (-2 << (bVar22 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar22 & 0x1f));
    }
    else {
      pcStack_540 = (code *)0x144e13;
      uVar56 = ra_scratch((ASMState *)local_508,0xffff0000);
      bVar22 = (byte)uVar56;
    }
    *(byte *)(local_508._128_8_ + -1) = ((byte)RVar36 & 7) + (char)uVar56 * '\b' | 0xc0;
    pbVar32 = (byte *)(local_508._128_8_ + -5);
    pbVar32[0] = 0xfc;
    pbVar32[1] = 0x66;
    pbVar32[2] = 0xf;
    pbVar32[3] = 0x7e;
    uVar50 = RVar36 >> 3 & 1 | uVar56 >> 1 & 4;
    pSVar53 = (SnapEntry *)(local_508._128_8_ + -4);
    if (uVar50 != 0) {
      pSVar53 = (SnapEntry *)(local_508._128_8_ + -5);
      *(byte *)(local_508._128_8_ + -4) = (byte)uVar50 | 0x40;
      *(byte *)pSVar53 = 0x66;
    }
    pcStack_540 = (code *)0x146733;
    local_508._128_8_ = pSVar53;
    RVar36 = asm_fuseload((ASMState *)local_508,(uint)(pIVar47->field_0).op2,
                          ~(1 << (bVar22 & 0x1f)) & 0xffff0000);
    pcStack_540 = (code *)0x146744;
    emit_mrm((ASMState *)local_508,XO_ADDSD,uVar56,RVar36);
    pcStack_540 = (code *)0x146752;
    ra_left((ASMState *)local_508,uVar56,(uint)(pIVar47->field_0).op1);
    goto switchD_001448dc_caseD_c;
  case '[':
    pcStack_540 = (code *)0x14535c;
    asm_snap_prep((ASMState *)local_508);
    local_400._4_4_ = local_400._4_4_ + 1;
    local_138[0].func._0_4_ = 0x7fff;
    if ((pIVar47->field_0).op2 == 1) {
      pCVar55 = lj_ir_callinfo + 5;
      local_138[0].func._4_4_ = 0x7ffd;
    }
    else {
      local_138[0].func._4_4_ = (uint)(pIVar47->field_0).op1;
      pCVar55 = lj_ir_callinfo + (ulong)((pIVar47->field_0).op2 != 0) * 2 + 4;
    }
    pcStack_540 = (code *)0x1461a0;
    asm_setupresult((ASMState *)local_508,pIVar47,pCVar55);
    pcStack_540 = (code *)0x1461ae;
    asm_gencall((ASMState *)local_508,pCVar55,(IRRef *)local_138);
    if ((pIVar47->field_0).op2 == 1) {
      RVar36 = (Reg)*(byte *)(local_508._144_8_ + 0x3ffee);
      iVar43 = 1 << (*(byte *)(local_508._144_8_ + 0x3ffee) & 0x1f);
      stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
      *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
      IVar44 = (IRRef)(pIVar47->field_0).op1;
LAB_00146df9:
      pcStack_540 = (code *)0x146e00;
      asm_tvptr((ASMState *)local_508,RVar36,IVar44);
    }
    goto switchD_001448dc_caseD_c;
  case '\\':
    pcStack_540 = (code *)0x144c5c;
    ra_evictset((ASMState *)local_508,0xffff0fc7);
    iVar43 = (local_42c & 0x1f) * 4 + (int)((MCode **)(local_508._152_8_ + 0x680))[local_42c >> 5];
    bVar22 = 0x84;
    iVar45 = (int)local_508._128_8_;
    if (local_508._128_8_ == local_3c8._0_8_) {
      local_44c = 1;
      *(int *)(local_508._128_8_ + 1) = (iVar43 - iVar45) + -5;
      if (local_3b8 == (SnapEntry *)0x0) {
        bVar22 = 0x85;
        iVar43 = iVar45;
        goto LAB_00144c92;
      }
      bVar57 = 0x75;
      lVar38 = -2;
      lVar63 = -1;
      bVar22 = 0;
    }
    else {
LAB_00144c92:
      *(int *)(local_508._128_8_ + -4) = iVar43 - iVar45;
      bVar57 = 0xf;
      lVar38 = -6;
      lVar63 = -5;
    }
    *(byte *)(local_508._128_8_ + lVar63) = bVar22;
    pbVar32 = (byte *)(local_508._128_8_ + lVar38);
    local_508._128_8_ = pbVar32 + -2;
    *pbVar32 = bVar57;
    *(undefined2 *)local_508._128_8_ = 0xc085;
    local_138[0].func._0_4_ = (uint)(pIVar47->field_0).op1;
    local_138[0].func._4_4_ = 0x7ffd;
    pcStack_540 = (code *)0x144ce9;
    asm_gencall((ASMState *)local_508,lj_ir_callinfo + 3,(IRRef *)local_138);
    bVar22 = *(byte *)(local_508._144_8_ + 0x3ffee);
    iVar43 = 1 << (bVar22 & 0x1f);
    stack0xfffffffffffffba0 = CONCAT44(iVar43,iVar43) | stack0xfffffffffffffba0;
    *(undefined1 *)(local_508._144_8_ + 0x3ffee) = 0xff;
    pcStack_540 = (code *)0x144d45;
    emit_rmro((ASMState *)local_508,XO_LEA,bVar22 | 0x80200,4,(uint)(pIVar47->field_1).s << 2);
    goto switchD_001448dc_caseD_c;
  case ']':
  case '_':
  case '`':
    goto switchD_001448dc_caseD_5d;
  case '^':
    local_400._4_4_ = local_400._4_4_ + 1;
switchD_001448dc_caseD_5d:
    uVar72 = (pIVar47->field_0).op2;
    pcStack_540 = (code *)0x1450c2;
    asm_collectargs((ASMState *)local_508,pIVar47,(CCallInfo *)(ulong)lj_ir_callinfo[uVar72].flags,
                    (IRRef *)local_138);
    pcStack_540 = (code *)0x1450d0;
    asm_setupresult((ASMState *)local_508,pIVar47,lj_ir_callinfo + uVar72);
    pcStack_540 = (code *)0x1450de;
    asm_gencall((ASMState *)local_508,lj_ir_callinfo + uVar72,(IRRef *)local_138);
    goto switchD_001448dc_caseD_c;
  case 'a':
    pcStack_540 = (code *)0x144fff;
    local_160 = asm_callx_flags((ASMState *)local_508,pIVar47);
    pcStack_540 = (code *)0x145020;
    asm_collectargs((ASMState *)local_508,pIVar47,(CCallInfo *)(ulong)local_160,(IRRef *)local_138);
    pcStack_540 = (code *)0x14502e;
    asm_setupresult((ASMState *)local_508,pIVar47,(CCallInfo *)&local_168.field_0);
    uVar46 = (ulong)(pIVar47->field_0).op2;
    pIVar47 = (IRIns *)(local_508._144_8_ + uVar46 * 8);
    if ((pIVar47->field_1).o == 'b') {
      uVar46 = (ulong)(pIVar47->field_0).op1;
      pIVar47 = (IRIns *)(local_508._144_8_ + uVar46 * 8);
    }
    if ((short)uVar46 < 0) {
LAB_00146afe:
      local_168 = (IRIns)0x0;
LAB_00146b0a:
      cVar5 = *(char *)(local_508._144_8_ + uVar46 * 8 + 6);
      RVar36 = (Reg)cVar5;
      if (cVar5 < '\0') {
        pcStack_540 = (code *)0x146b27;
        RVar36 = ra_allocref((ASMState *)local_508,(IRRef)uVar46,0xf028);
      }
      bVar22 = (byte)RVar36 & 0x1f;
      uStack_458 = uStack_458 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22);
      *(byte *)(local_508._128_8_ + -1) = (byte)RVar36 & 7 | 0xd0;
      *(byte *)(local_508._128_8_ + -2) = 0xff;
      if ((RVar36 & 8) == 0) {
        local_508._128_8_ = local_508._128_8_ + -2;
      }
      else {
        *(byte *)(local_508._128_8_ + -3) = 0x41;
        local_508._128_8_ = local_508._128_8_ + -3;
      }
    }
    else {
      if ((pIVar47->field_1).o == '\x1d') {
        local_168 = pIVar47[1];
      }
      else {
        local_168._4_4_ = 0;
        local_168.field_1.op12 = (pIVar47->field_1).op12;
      }
      if ((long)(int)((long)local_168 - local_508._128_8_) != (long)local_168 - local_508._128_8_)
      goto LAB_00146afe;
      if (local_168 == (IRIns)0x0) goto LAB_00146b0a;
    }
    pcStack_540 = (code *)0x146b83;
    asm_gencall((ASMState *)local_508,(CCallInfo *)&local_168.field_0,(IRRef *)local_138);
    goto switchD_001448dc_caseD_c;
  }
  pcStack_540 = (code *)0x146c10;
  emit_mrm((ASMState *)local_508,xVar68,RVar36,0x20);
  goto switchD_001448dc_caseD_c;
LAB_00147ec0:
  if ((local_3b8 == (SnapEntry *)0x0) ||
     (pGVar28 = local_150->curfinal, J = local_150, pGVar28->nins < local_148->nins)) {
    if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) {
LAB_001489c9:
      pcStack_540 = (code *)0x1489d3;
      asm_mclimit((ASMState *)local_508);
    }
    if (0 < local_400._4_4_) {
      local_440 = (IRRef)local_3f8->snap->ref;
      pcStack_540 = (code *)0x147f39;
      asm_snap_prep((ASMState *)local_508);
      pcStack_540 = (code *)0x147f41;
      asm_gc_check((ASMState *)local_508);
      local_440 = local_43c;
    }
    if ((uint)local_508._168_4_ < 0xffff0000) {
      uVar56 = ~local_508._168_4_ & 0xffff0000;
      do {
        uVar50 = 0;
        if (uVar56 != 0) {
          for (; (uVar56 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
          }
        }
        if (*(ushort *)(local_508 + (ulong)uVar50 * 4) < 0x8000) {
          pcStack_540 = (code *)0x147f80;
          ra_rematk((ASMState *)local_508,(uint)*(ushort *)(local_508 + (ulong)uVar50 * 4));
          if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
        }
        bVar22 = (byte)uVar50 & 0x1f;
        uVar56 = uVar56 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22);
      } while (uVar56 != 0);
    }
    if ((local_508._168_4_ & 0xffef) != 0xffef) {
      uVar56 = local_508._168_4_ & 0xffef ^ 0xffef;
      do {
        uVar50 = 0;
        if (uVar56 != 0) {
          for (; (uVar56 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
          }
        }
        if (*(ushort *)(local_508 + (ulong)uVar50 * 4) < 0x8000) {
          pcStack_540 = (code *)0x147fd5;
          ra_rematk((ASMState *)local_508,(uint)*(ushort *)(local_508 + (ulong)uVar50 * 4));
          if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
        }
        bVar22 = (byte)uVar50 & 0x1f;
        uVar56 = uVar56 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22);
      } while (uVar56 != 0);
    }
    auVar19 = stack0xfffffffffffffba0;
    if (local_3f0 != (GCtrace *)0x0) {
      pIVar47 = local_3f0->ir;
      if ((local_42c != 0) && (local_3f0->topslot < (BCReg)local_400)) {
        pcStack_540 = (code *)0x148030;
        asm_snap_alloc((ASMState *)local_508,0);
      }
      bVar22 = *(byte *)(local_508._144_8_ + 0x40006);
      local_178 = pIVar47;
      uVar56 = 0x80;
      if (-1 < (char)bVar22) {
        uVar56 = (uint)bVar22;
        uVar50 = local_508._168_4_ | 1 << (uVar56 & 0x1f);
        RVar52 = RStack_45c;
        local_508._168_4_ = uVar50;
        if (((RVar52 >> (uVar56 & 0x1f) & 1) != 0) ||
           ((*(byte *)(local_508._144_8_ + 0x40004) & 0x20) != 0)) {
          *(undefined1 *)(local_508._144_8_ + 0x40006) = 0xff;
        }
        bVar57 = *(byte *)((long)pIVar47 + 0x40006);
        if (bVar57 != bVar22) {
          if (((char)bVar57 < '\0') || ((uVar50 >> (bVar57 & 0x1f) & 1) == 0)) {
            *(SnapEntry *)(local_508._128_8_ + -4) = local_508._152_4_ - 0xb8;
            *(byte *)(local_508._128_8_ + -5) = 0x25;
            *(byte *)(local_508._128_8_ + -6) = bVar22 * '\b' & 0x38 | 4;
            *(byte *)(local_508._128_8_ + -7) = 0x8b;
            if ((bVar22 & 8) == 0) {
              local_508._128_8_ = local_508._128_8_ + -7;
            }
            else {
              *(byte *)(local_508._128_8_ + -8) = 0x44;
              local_508._128_8_ = local_508._128_8_ + -8;
            }
            uVar56 = 0x80;
          }
          else {
            *(byte *)(local_508._128_8_ + -1) = bVar57 & 7 | bVar22 * '\b' | 0xc0;
            *(byte *)(local_508._128_8_ + -2) = 0x8b;
            bVar22 = bVar57 >> 3 & 1 | bVar22 >> 1 & 4;
            if (bVar22 == 0) {
              local_508._128_8_ = local_508._128_8_ + -2;
            }
            else {
              *(byte *)(local_508._128_8_ + -3) = bVar22 | 0x40;
              local_508._128_8_ = local_508._128_8_ + -3;
            }
            uVar56 = (uint)*(byte *)((long)pIVar47 + 0x40006);
          }
        }
      }
      bVar22 = (byte)uVar56 & 0x1f;
      uVar69 = -2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22;
      uVar50 = uVar69 & 0xffef;
      if (uVar56 == 0x80) {
        uVar50 = 0xffef;
      }
      if (uVar56 == 0x80) {
        uVar69 = 0xffffffef;
      }
      uVar46 = (ulong)local_43c;
      if (uVar46 < 0x8001) {
        iVar43 = 0;
        bVar71 = true;
        local_520 = (SnapEntry *)((ulong)local_520._4_4_ << 0x20);
      }
      else {
        puVar39 = auStack_10372 + uVar46;
        lVar38 = uVar46 << 3;
        local_520 = (SnapEntry *)((ulong)local_520._4_4_ << 0x20);
        local_518 = (IRIns *)((ulong)local_518 & 0xffffffff00000000);
        local_524 = 0;
        do {
          uVar18 = local_508._144_8_;
          uVar72 = *puVar39;
          bVar22 = *(byte *)(local_508._144_8_ + lVar38 + 6);
          uVar42 = (ushort)bVar22;
          if ((char)bVar22 < '\0') {
            if (*(char *)(local_508._144_8_ + lVar38 + 7) != '\0') {
              pbVar32 = (byte *)(local_508._144_8_ + lVar38 + 4);
              *pbVar32 = *pbVar32 | 0x20;
              local_518 = (IRIns *)CONCAT44(local_518._4_4_,1);
            }
          }
          else {
            uVar69 = uVar69 & ~(1 << (bVar22 & 0x1f));
            bVar57 = *(byte *)(local_508._144_8_ + lVar38 + 7);
            if (bVar57 != 0) {
              local_530 = CONCAT44(local_530._4_4_,uVar69);
              local_510 = (SnapEntry *)CONCAT44(local_510._4_4_,uVar50);
              pIVar47 = (IRIns *)(lVar38 + local_508._144_8_);
              pcStack_540 = (code *)0x148389;
              emit_storeofs((ASMState *)local_508,pIVar47,(uint)bVar22,4,(uint)bVar57 << 2);
              if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
              bVar22 = (pIVar47->field_1).r;
              uVar42 = (ushort)bVar22;
              uVar50 = (uint)local_510;
              uVar69 = (uint)local_530;
            }
          }
          uVar56 = (uint)uVar72;
          if (uVar42 == uVar72) {
            local_508._168_4_ = local_508._168_4_ | 1 << ((byte)uVar72 & 0x1f);
          }
          else if (uVar72 < 0x100) {
            if ((-1 < (char)bVar22) || (*(char *)(uVar18 + lVar38 + 7) != '\0')) {
              *(short *)((long)&local_138[0].func + (ulong)uVar56 * 2) = (short)uVar46;
              local_520 = (SnapEntry *)
                          CONCAT44(local_520._4_4_,(uint)local_520 | 1 << (uVar56 & 0x1f));
            }
          }
          else if (-1 < (char)bVar22) {
            local_524 = 1;
          }
          bVar22 = (byte)uVar72 & 0x1f;
          uVar26 = -2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22;
          if (0xff < uVar56) {
            uVar26 = 0xffffffff;
          }
          uVar50 = uVar50 & uVar26;
          uVar56 = (int)uVar46 - 1;
          uVar46 = (ulong)uVar56;
          puVar39 = puVar39 + -1;
          lVar38 = lVar38 + -8;
        } while (0x8000 < uVar56);
        bVar71 = (int)local_518 == 0;
        iVar43 = local_524;
      }
      local_510 = (SnapEntry *)CONCAT44(local_510._4_4_,uVar50);
      uVar56 = local_448 * 4 - 4 & 0xfffffff0;
      if ((int)local_448 < 5) {
        uVar56 = 0;
      }
      uVar50 = uVar56 - local_3f0->spadjust;
      uVar46 = 0;
      if (0 < (int)uVar50) {
        uVar46 = (ulong)uVar50;
      }
      if ((int)uVar50 < 0) {
        uVar56 = (uint)local_3f0->spadjust;
      }
      local_3f8->spadjust = (uint16_t)uVar56;
      uVar56 = (uint)local_520;
      if ((!bVar71) && (uVar67 = (ulong)local_43c, 0x8000 < uVar67)) {
        local_16c = uVar50;
        local_158 = uVar46;
        puVar39 = auStack_10372 + uVar67;
        lVar38 = uVar67 << 3;
        local_524 = iVar43;
        do {
          uVar18 = local_508._144_8_;
          bVar22 = *(byte *)(local_508._144_8_ + lVar38 + 4);
          if ((bVar22 & 0x20) != 0) {
            *(byte *)(local_508._144_8_ + lVar38 + 4) = bVar22 & 0xdf;
            uVar72 = *puVar39;
            if (uVar72 < 0x100) {
              *(byte *)(local_508._144_8_ + lVar38 + 6) = (byte)uVar72 | 0x80;
            }
            else if ((int)local_158 + (uint)(uVar72 >> 8) * 4 ==
                     (uint)*(byte *)(local_508._144_8_ + lVar38 + 7) << 2) goto LAB_00148628;
            uVar50 = 0xffff0000;
            if (1 < (byte)((bVar22 & 0x1f) - 0xd)) {
              uVar50 = 0xffef;
            }
            local_520 = (SnapEntry *)CONCAT44(local_520._4_4_,uVar56);
            local_530 = CONCAT44(local_530._4_4_,uVar69);
            if ((uVar50 & uVar69) == 0) goto LAB_00148ba1;
            local_518 = (IRIns *)(local_508._144_8_ + lVar38);
            pcStack_540 = (code *)0x1485a4;
            RVar36 = ra_allocref((ASMState *)local_508,(IRRef)uVar67,uVar50 & uVar69);
            pcStack_540 = (code *)0x1485c7;
            emit_storeofs((ASMState *)local_508,local_518,RVar36,4,
                          (uint)*(byte *)(uVar18 + lVar38 + 7) << 2);
            bVar22 = (byte)RVar36 & 0x1f;
            if (RVar36 == uVar72) {
              local_508._168_4_ = local_508._168_4_ | 1 << ((byte)RVar36 & 0x1f);
              uVar56 = (uint)local_520 & (-2 << bVar22 | 0xfffffffeU >> 0x20 - bVar22);
            }
            else {
              uVar56 = (uint)local_520;
              if (0xff < uVar72) {
                local_524 = 1;
              }
            }
            if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
            uVar69 = (uint)local_530 & ~(1 << (RVar36 & 0x1f));
          }
LAB_00148628:
          uVar26 = (IRRef)uVar67 - 1;
          uVar67 = (ulong)uVar26;
          puVar39 = puVar39 + -1;
          lVar38 = lVar38 + -8;
          uVar46 = local_158;
          iVar43 = local_524;
          uVar50 = local_16c;
        } while (0x8000 < uVar26);
      }
      pIVar47 = local_178;
      uVar18 = local_508._128_8_;
      *(uint *)(local_508._128_8_ + -4) = (uint)local_3f8->traceno;
      *(SnapEntry *)(local_508._128_8_ + -8) = local_508._152_4_ - 0xe8;
      *(byte *)(local_508._128_8_ + -9) = 0x25;
      ((byte *)(local_508._128_8_ + -0xb))[0] = 199;
      ((byte *)(local_508._128_8_ + -0xb))[1] = 4;
      local_508._128_8_ = (SnapEntry *)(local_508._128_8_ + -0xb);
      if (0 < (int)uVar50) {
        if (uVar50 < 0x81) {
          *(byte *)(uVar18 + -0xc) = (byte)-(int)uVar46;
          pSVar53 = (SnapEntry *)(uVar18 + -0xc);
          uVar35 = 0x830000fe;
        }
        else {
          *(int *)(uVar18 + -0xf) = -(int)uVar46;
          pSVar53 = (SnapEntry *)(uVar18 + -0xf);
          uVar35 = 0x810000fe;
        }
        *(byte *)((long)pSVar53 + -1) = 0xc4;
        *(undefined4 *)((long)pSVar53 + -5) = uVar35;
        *(byte *)((long)pSVar53 + -3) = 0x48;
        local_508._128_8_ = (SnapEntry *)((long)pSVar53 + -3);
      }
      if (iVar43 != 0) {
        if ((local_508._168_4_ & 0xffffffef) != 0xffffffef) {
          uVar50 = local_508._168_4_ & 0xffffffef ^ 0xffffffef;
          do {
            uVar26 = 0;
            if (uVar50 != 0) {
              for (; (uVar50 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            if (0xff < local_370[*(ushort *)(local_508 + (ulong)uVar26 * 4) - 0x8001]) {
              local_508._168_4_ = local_508._168_4_ | 1 << ((byte)uVar26 & 0x1f);
              pcStack_540 = (code *)0x14874d;
              emit_loadofs((ASMState *)local_508,
                           (IRIns *)(local_508._144_8_ +
                                    (ulong)*(ushort *)(local_508 + (ulong)uVar26 * 4) * 8),uVar26,4,
                           local_370[*(ushort *)(local_508 + (ulong)uVar26 * 4) - 0x8001] >> 6 &
                           0xfffffffc);
              if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
            }
            uVar50 = uVar50 & ~(1 << (uVar26 & 0x1f));
          } while (uVar50 != 0);
        }
      }
      local_178 = pIVar47 + 0x8000;
      do {
        uVar50 = uVar56 & 0xffef;
        local_530 = CONCAT44(local_530._4_4_,uVar69);
        iVar43 = 0;
        if ((uVar56 & 0xffef) != 0) {
          for (; (uVar50 >> iVar43 & 1) == 0; iVar43 = iVar43 + 1) {
          }
        }
        local_520 = (SnapEntry *)CONCAT44(local_520._4_4_,iVar43);
        uVar26 = uVar56 & 0xffff0000;
        RVar36 = 0;
        if ((uVar56 & 0xffff0000) != 0) {
          for (; (uVar26 >> RVar36 & 1) == 0; RVar36 = RVar36 + 1) {
          }
        }
        while( true ) {
          uVar37 = local_508._168_4_ & uVar56;
          if (uVar37 != 0) break;
          if (uVar56 == 0) {
            bVar22 = local_3f0->topslot;
            local_3f8->topslot = bVar22;
            if (bVar22 < (BCReg)local_400) {
              exitno = *(ExitNo *)(local_508._152_8_ + 0x9ac);
              local_3f8->topslot = (uint8_t)local_400;
              pcStack_540 = (code *)0x1488ce;
              asm_stack_check((ASMState *)local_508,(BCReg)local_400,local_178,(uint)local_510,
                              exitno);
            }
            goto LAB_001488ce;
          }
          if (uVar50 != 0) {
            uVar37 = local_508._168_4_ & (uVar50 ^ 0xffef) & uVar69;
            if (uVar37 == 0) goto LAB_00148ba1;
            RVar24 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> RVar24 & 1) == 0; RVar24 = RVar24 + 1) {
              }
            }
            pcStack_540 = (code *)0x1487e4;
            ra_rename((ASMState *)local_508,(uint)local_520,RVar24);
          }
          if (uVar26 != 0) {
            uVar37 = local_508._168_4_ & (uVar26 ^ 0xffff0000) & (uint)local_530;
            if (uVar37 == 0) goto LAB_00148ba1;
            RVar24 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> RVar24 & 1) == 0; RVar24 = RVar24 + 1) {
              }
            }
            pcStack_540 = (code *)0x14880f;
            ra_rename((ASMState *)local_508,RVar36,RVar24);
          }
          if ((ulong)local_508._128_8_ < (ulong)local_508._136_8_) goto LAB_001489c9;
        }
        uVar50 = 0;
        if (uVar37 != 0) {
          for (; (uVar37 >> uVar50 & 1) == 0; uVar50 = uVar50 + 1) {
          }
        }
        pIVar47 = (IRIns *)(local_508._144_8_ +
                           (ulong)*(ushort *)((long)&local_138[0].func + (ulong)uVar50 * 2) * 8);
        uVar56 = uVar56 & ~(1 << (uVar50 & 0x1f));
        uVar69 = (uint)local_530 & ~(1 << (uVar50 & 0x1f));
        local_508._168_4_ = local_508._168_4_ | 1 << ((pIVar47->field_1).r & 0x1f);
        pcStack_540 = (code *)0x148868;
        emit_movrr((ASMState *)local_508,pIVar47,(uint)(pIVar47->field_1).r,uVar50);
      } while ((ulong)local_508._136_8_ <= (ulong)local_508._128_8_);
      goto LAB_001489c9;
    }
    bVar22 = *(byte *)(local_508._144_8_ + 0x40006);
    pSVar53 = (SnapEntry *)local_508._128_8_;
    if (-1 < (char)bVar22) {
      local_508._168_4_ = local_508._168_4_ | 1 << (bVar22 & 0x1f);
      auVar20 = stack0xfffffffffffffba0;
      RStack_45c = auVar19._4_4_;
      if (((RStack_45c >> (bVar22 & 0x1f) & 1) != 0) ||
         ((*(byte *)(local_508._144_8_ + 0x40004) & 0x20) != 0)) {
        *(undefined1 *)(local_508._144_8_ + 0x40006) = 0xff;
      }
      unique0x100048c9 = auVar20;
      if (bVar22 != 2) {
        *(byte *)(local_508._128_8_ + -1) = bVar22 * '\b' | 0xc2;
        *(byte *)(local_508._128_8_ + -2) = 0x8b;
        if ((bVar22 & 8) == 0) {
          pSVar53 = (SnapEntry *)(local_508._128_8_ + -2);
        }
        else {
          *(byte *)(local_508._128_8_ + -3) = 0x44;
          pSVar53 = (SnapEntry *)(local_508._128_8_ + -3);
        }
      }
    }
    pSVar53[-1] = (uint)local_3f8->traceno;
    pSVar53[-2] = local_508._152_4_ - 0xe8;
    *(byte *)((long)pSVar53 + -9) = 0x25;
    ((byte *)((long)pSVar53 + -0xb))[0] = 199;
    ((byte *)((long)pSVar53 + -0xb))[1] = 4;
    local_508._128_8_ = (SnapEntry *)((long)pSVar53 + -0xb);
    uVar56 = local_448 * 4 - 4 & 0xfffffff0;
    if ((int)local_448 < 5) {
      uVar56 = 0;
    }
    local_3f8->spadjust = (uint16_t)uVar56;
    if (uVar56 != 0) {
      if (uVar56 + 0x7f < 0x100) {
        *(byte *)(pSVar53 + -3) = (byte)-uVar56;
        pSVar53 = pSVar53 + -3;
        uVar35 = 0x830000fe;
      }
      else {
        *(uint *)((long)pSVar53 + -0xf) = -uVar56;
        pSVar53 = (SnapEntry *)((long)pSVar53 + -0xf);
        uVar35 = 0x810000fe;
      }
      *(byte *)((long)pSVar53 + -1) = 0xc4;
      *(undefined4 *)((long)pSVar53 + -5) = uVar35;
      *(byte *)((long)pSVar53 + -3) = 0x48;
      local_508._128_8_ = (SnapEntry *)((long)pSVar53 + -3);
    }
    local_3f8->topslot = *(uint8_t *)((ulong)(local_3f8->startpt).gcptr32 + 7);
LAB_001488ce:
    J = local_150;
    pGVar28 = local_148;
    for (uVar56 = uStack_454; local_150 = J, local_148 = pGVar28, uVar56 != 0;
        uVar56 = uVar56 & (-2 << bVar57 | 0xfffffffeU >> 0x20 - bVar57)) {
      uVar69 = uVar56 >> 0x18 | (uVar56 & 0xff0000) >> 8 | (uVar56 & 0xff00) << 8 | uVar56 << 0x18;
      uVar50 = 0x1f;
      if (uVar69 != 0) {
        for (; uVar69 >> uVar50 == 0; uVar50 = uVar50 - 1) {
        }
      }
      uVar72 = *(ushort *)(local_3b0 + (ulong)(uVar50 ^ 0x18) * 2);
      uVar46 = (ulong)uVar72;
      bVar22 = *(byte *)(local_508._144_8_ + uVar46 * 8 + 4);
      bVar57 = (byte)(uVar50 ^ 0x18);
      if (((bVar22 & 0x20) != 0) &&
         (*(byte *)(local_508._144_8_ + uVar46 * 8 + 4) = bVar22 & 0xdf,
         *(char *)(local_508._144_8_ + uVar46 * 8 + 7) != '\0')) {
        (((jit_State *)local_508._152_8_)->fold).ins.field_0.ot = 0x1400;
        (((jit_State *)local_508._152_8_)->fold).ins.field_0.op1 = uVar72;
        (((jit_State *)local_508._152_8_)->fold).ins.field_0.op2 = (IRRef1)local_428;
        pcStack_540 = (code *)0x14893a;
        TVar27 = lj_ir_emit((jit_State *)local_508._152_8_);
        uVar46 = (ulong)((TVar27 & 0xffff) << 3);
        *(byte *)((long)((GCtrace *)local_508._152_8_)->ir + uVar46 + 6) = bVar57;
        *(undefined1 *)((long)((GCtrace *)local_508._152_8_)->ir + uVar46 + 7) = 0;
      }
      bVar57 = bVar57 & 0x1f;
      J = local_150;
      pGVar28 = local_148;
    }
    T_00 = J->curfinal;
    if (pGVar28->nins <= T_00->nins) {
      pcStack_540 = (code *)0x1489fb;
      memcpy(T_00->ir + local_438,pGVar28->ir + local_438,(ulong)(pGVar28->nins - local_438) << 3);
      pGVar28->nins = J->curfinal->nins;
      local_440 = 0x8001;
      pcStack_540 = (code *)0x148a18;
      asm_snap_prev((ASMState *)local_508);
      if (local_508._168_4_ == 0xffffffef) {
        pGVar28->mcode = (MCode *)local_508._128_8_;
        MVar60 = 0;
        if (local_3d0 != (SnapEntry *)0x0) {
          MVar60 = (int)local_3d0 - (int)local_508._128_8_;
        }
        pGVar28->mcloop = MVar60;
        pSVar53 = local_3e0;
        if (local_404 == 0) {
          uVar72 = pGVar28->link;
          uVar42 = local_3f8->spadjust;
          if (uVar42 == 0) {
            pSVar53 = (SnapEntry *)((long)local_3e0 + -7);
          }
          else {
            if ((uint)uVar42 == (int)(char)(byte)uVar42) {
              *(byte *)((long)local_3e0 + -9) = (byte)uVar42;
              bVar22 = 0x83;
              pSVar53 = (SnapEntry *)((long)local_3e0 + -3);
            }
            else {
              *(uint *)((long)local_3e0 + -9) = (uint)uVar42;
              bVar22 = 0x81;
            }
            *(byte *)(local_3e0 + -3) = 0x48;
            *(byte *)((long)local_3e0 + -0xb) = bVar22;
            *(byte *)((long)local_3e0 + -10) = 0xc4;
          }
          if ((ulong)uVar72 == 0) {
            iVar43 = 0x1423f6;
          }
          else {
            iVar43 = (int)*(undefined8 *)
                           ((ulong)(*(GCRef **)(local_508._152_8_ + 0x170))[uVar72].gcptr32 + 0x40);
          }
          pSVar53[-1] = iVar43 - (int)pSVar53;
          *(byte *)((long)pSVar53 + -5) = 0xe9;
          if (pSVar53 <= (SnapEntry *)((long)local_3e0 - 1U)) {
            pbVar32 = (byte *)((long)local_3e0 - 2U);
            if ((byte *)((long)pSVar53 - 1U) < (byte *)((long)local_3e0 - 2U)) {
              pbVar32 = (byte *)((long)pSVar53 - 1U);
            }
            pcStack_540 = (code *)0x148b07;
            memset(pbVar32 + 1,0x90,(size_t)(~(ulong)pbVar32 + (long)local_3e0));
          }
        }
        local_3e0 = pSVar53;
        pGVar28->szmcode = (int)local_3e0 - (int)local_508._128_8_;
        pSVar8 = local_3f8->snap;
        uVar56 = local_3f8->nsnap - 1;
        if (uVar56 != 0) {
          uVar46 = (ulong)uVar56;
          puVar62 = &pSVar8[uVar46].mcofs;
          do {
            uVar46 = uVar46 - 1;
            *puVar62 = ((short)local_3d8 - (short)local_508._128_8_) -
                       pSVar8[uVar46 & 0xffffffff].mcofs;
            puVar62 = puVar62 + -6;
          } while ((int)uVar46 != 0);
        }
        pSVar8->mcofs = 0;
        pcStack_540 = (code *)0x148b82;
        lj_mcode_sync(pGVar28->mcode,local_3d8);
        return;
      }
      pcStack_540 = asm_snap_prev;
      lj_trace_err((jit_State *)local_508._152_8_,LJ_TRERR_BADRA);
    }
    pcStack_540 = (code *)0x14899c;
    lj_trace_free(local_140,T_00);
    J->curfinal = (GCtrace *)0x0;
    pcStack_540 = (code *)0x1489ae;
    pGVar28 = lj_trace_alloc(J->L,pGVar28);
    J->curfinal = pGVar28;
    local_3b8 = (SnapEntry *)0x0;
  }
  goto LAB_00143d8f;
}

Assistant:

void lj_asm_trace(jit_State *J, GCtrace *T)
{
  ASMState as_;
  ASMState *as = &as_;

  /* Remove nops/renames left over from ASM restart due to LJ_TRERR_MCODELM. */
  {
    IRRef nins = T->nins;
    IRIns *ir = &T->ir[nins-1];
    if (ir->o == IR_NOP || ir->o == IR_RENAME) {
      do { ir--; nins--; } while (ir->o == IR_NOP || ir->o == IR_RENAME);
      T->nins = nins;
    }
  }

  /* Ensure an initialized instruction beyond the last one for HIOP checks. */
  /* This also allows one RENAME to be added without reallocating curfinal. */
  as->orignins = lj_ir_nextins(J);
  lj_ir_nop(&J->cur.ir[as->orignins]);

  /* Setup initial state. Copy some fields to reduce indirections. */
  as->J = J;
  as->T = T;
  J->curfinal = lj_trace_alloc(J->L, T);  /* This copies the IR, too. */
  as->flags = J->flags;
  as->loopref = J->loopref;
  as->realign = NULL;
  as->loopinv = 0;
  as->parent = J->parent ? traceref(J, J->parent) : NULL;

  /* Reserve MCode memory. */
  as->mctop = as->mctoporig = lj_mcode_reserve(J, &as->mcbot);
  as->mcp = as->mctop;
  as->mclim = as->mcbot + MCLIM_REDZONE;
  asm_setup_target(as);

  /*
  ** This is a loop, because the MCode may have to be (re-)assembled
  ** multiple times:
  **
  ** 1. as->realign is set (and the assembly aborted), if the arch-specific
  **    backend wants the MCode to be aligned differently.
  **
  **    This is currently only the case on x86/x64, where small loops get
  **    an aligned loop body plus a short branch. Not much effort is wasted,
  **    because the abort happens very quickly and only once.
  **
  ** 2. The IR is immovable, since the MCode embeds pointers to various
  **    constants inside the IR. But RENAMEs may need to be added to the IR
  **    during assembly, which might grow and reallocate the IR. We check
  **    at the end if the IR (in J->cur.ir) has actually grown, resize the
  **    copy (in J->curfinal.ir) and try again.
  **
  **    95% of all traces have zero RENAMEs, 3% have one RENAME, 1.5% have
  **    2 RENAMEs and only 0.5% have more than that. That's why we opt to
  **    always have one spare slot in the IR (see above), which means we
  **    have to redo the assembly for only ~2% of all traces.
  **
  **    Very, very rarely, this needs to be done repeatedly, since the
  **    location of constants inside the IR (actually, reachability from
  **    a global pointer) may affect register allocation and thus the
  **    number of RENAMEs.
  */
  for (;;) {
    as->mcp = as->mctop;
#ifdef LUA_USE_ASSERT
    as->mcp_prev = as->mcp;
#endif
    as->ir = J->curfinal->ir;  /* Use the copied IR. */
    as->curins = J->cur.nins = as->orignins;

    RA_DBG_START();
    RA_DBGX((as, "===== STOP ====="));

    /* General trace setup. Emit tail of trace. */
    asm_tail_prep(as);
    as->mcloop = NULL;
    as->flagmcp = NULL;
    as->topslot = 0;
    as->gcsteps = 0;
    as->sectref = as->loopref;
    as->fuseref = (as->flags & JIT_F_OPT_FUSE) ? as->loopref : FUSE_DISABLED;
    asm_setup_regsp(as);
    if (!as->loopref)
      asm_tail_link(as);

    /* Assemble a trace in linear backwards order. */
    for (as->curins--; as->curins > as->stopins; as->curins--) {
      IRIns *ir = IR(as->curins);
      /* 64 bit types handled by SPLIT for 32 bit archs. */
      lj_assertA(!(LJ_32 && irt_isint64(ir->t)),
		 "IR %04d has unsplit 64 bit type",
		 (int)(ir - as->ir) - REF_BIAS);
      asm_snap_prev(as);
      if (!ra_used(ir) && !ir_sideeff(ir) && (as->flags & JIT_F_OPT_DCE))
	continue;  /* Dead-code elimination can be soooo easy. */
      if (irt_isguard(ir->t))
	asm_snap_prep(as);
      RA_DBG_REF();
      checkmclim(as);
      asm_ir(as, ir);
    }

    if (as->realign && J->curfinal->nins >= T->nins)
      continue;  /* Retry in case only the MCode needs to be realigned. */

    /* Emit head of trace. */
    RA_DBG_REF();
    checkmclim(as);
    if (as->gcsteps > 0) {
      as->curins = as->T->snap[0].ref;
      asm_snap_prep(as);  /* The GC check is a guard. */
      asm_gc_check(as);
      as->curins = as->stopins;
    }
    ra_evictk(as);
    if (as->parent)
      asm_head_side(as);
    else
      asm_head_root(as);
    asm_phi_fixup(as);

    if (J->curfinal->nins >= T->nins) {  /* IR didn't grow? */
      lj_assertA(J->curfinal->nk == T->nk, "unexpected IR constant growth");
      memcpy(J->curfinal->ir + as->orignins, T->ir + as->orignins,
	     (T->nins - as->orignins) * sizeof(IRIns));  /* Copy RENAMEs. */
      T->nins = J->curfinal->nins;
      /* Fill mcofs of any unprocessed snapshots. */
      as->curins = REF_FIRST;
      asm_snap_prev(as);
      break;  /* Done. */
    }

    /* Otherwise try again with a bigger IR. */
    lj_trace_free(J2G(J), J->curfinal);
    J->curfinal = NULL;  /* In case lj_trace_alloc() OOMs. */
    J->curfinal = lj_trace_alloc(J->L, T);
    as->realign = NULL;
  }

  RA_DBGX((as, "===== START ===="));
  RA_DBG_FLUSH();
  if (as->freeset != RSET_ALL)
    lj_trace_err(as->J, LJ_TRERR_BADRA);  /* Ouch! Should never happen. */

  /* Set trace entry point before fixing up tail to allow link to self. */
  T->mcode = as->mcp;
  T->mcloop = as->mcloop ? (MSize)((char *)as->mcloop - (char *)as->mcp) : 0;
  if (!as->loopref)
    asm_tail_fixup(as, T->link);  /* Note: this may change as->mctop! */
  T->szmcode = (MSize)((char *)as->mctop - (char *)as->mcp);
  asm_snap_fixup_mcofs(as);
#if LJ_TARGET_MCODE_FIXUP
  asm_mcode_fixup(T->mcode, T->szmcode);
#endif
  lj_mcode_sync(T->mcode, as->mctoporig);
}